

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NewFrame(void)

{
  ImVec2 *pIVar1;
  ImDrawListFlags *pIVar2;
  bool *pbVar3;
  int *piVar4;
  ImGuiNextWindowData *pIVar5;
  ImS8 *pIVar6;
  float *pfVar7;
  ImU16 *pIVar8;
  ImVec2 *pIVar9;
  ImGuiID IVar10;
  uint uVar11;
  ImGuiContextHook *pIVar12;
  ImFontAtlas *pIVar13;
  ImGuiPlatformMonitor *pIVar14;
  uint *puVar15;
  _func_bool_ImGuiViewport_ptr *p_Var16;
  ImGuiWindow **ppIVar17;
  ImGuiViewport **ppIVar18;
  _func_float_ImGuiViewport_ptr *p_Var19;
  ImGuiViewportP **ppIVar20;
  ImGuiInputEvent *pIVar21;
  _func_void_ImGuiViewport_ptr *p_Var22;
  ImGuiTableTempData *pIVar23;
  ImGuiWindowStackData *pIVar24;
  ImGuiPopupData *pIVar25;
  int *piVar26;
  ImGuiGroupData *pIVar27;
  ImGuiStackLevelInfo *pIVar28;
  undefined8 uVar29;
  undefined1 auVar30 [16];
  ImGuiContext *ctx;
  ImGuiContext *pIVar31;
  undefined3 uVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  int iVar37;
  ImGuiContext *g_1;
  uint *__dest;
  ImGuiViewport **ppIVar38;
  ImGuiViewportP *pIVar39;
  ImGuiContext *pIVar40;
  ImGuiKeyData *pIVar41;
  ImGuiWindow *pIVar42;
  ImGuiWindowStackData *__dest_00;
  ImGuiPopupData *__dest_01;
  int *piVar43;
  ImGuiGroupData *__dest_02;
  ImGuiStackLevelInfo *__dest_03;
  int i;
  uint uVar44;
  ImGuiScrollFlags scroll_flags;
  ImGuiViewportP *pIVar45;
  ulong uVar46;
  ImGuiWindow *window;
  char *pcVar47;
  ImGuiWindow *parent;
  long lVar48;
  ulong uVar49;
  ImGuiWindow *pIVar50;
  ImGuiContext *g;
  int iVar51;
  ImGuiID IVar52;
  ImRect *pIVar53;
  float *pfVar54;
  ImGuiNavLayer IVar55;
  ImFont *font;
  float *pfVar56;
  int i_1;
  byte bVar57;
  ImGuiContext *g_3;
  long lVar58;
  ImGuiContext *pIVar59;
  ImGuiWindow *old_nav_window;
  long lVar60;
  long lVar61;
  float fVar62;
  float fVar63;
  undefined4 uVar70;
  ImVec2 IVar64;
  ImVec2 IVar65;
  ImVec2 IVar66;
  ImVec2 IVar67;
  ImVec2 IVar68;
  ImVec2 IVar69;
  undefined4 uVar71;
  undefined1 extraout_var [12];
  undefined4 uVar72;
  float scale;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  ImVec2 IVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  uint uVar81;
  uint uVar82;
  uint uVar83;
  ImVec2 main_viewport_pos;
  ImRect local_a8;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined4 local_6c;
  undefined1 local_68 [24];
  ImVec2 local_50;
  undefined1 local_48 [16];
  
  ctx = GImGui;
  bVar57 = 0;
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x1140,"void ImGui::NewFrame()");
  }
  lVar58 = (long)(GImGui->Hooks).Size;
  if (0 < lVar58) {
    lVar60 = -lVar58;
    lVar61 = lVar58 << 5;
    do {
      lVar48 = (long)(ctx->Hooks).Size;
      if (lVar48 < lVar58) {
        pcVar47 = "T &ImVector<ImGuiContextHook>::operator[](int) [T = ImGuiContextHook]";
        goto LAB_00156b70;
      }
      pIVar12 = (ctx->Hooks).Data;
      if (*(int *)(pIVar12 + lVar61 + -0x1c) == 7) {
        memmove(pIVar12 + lVar61 + -0x20,pIVar12 + lVar61,(lVar48 + lVar60) * 0x20);
        (ctx->Hooks).Size = (ctx->Hooks).Size + -1;
      }
      lVar60 = lVar60 + 1;
      bVar33 = 1 < lVar58;
      lVar58 = lVar58 + -1;
      lVar61 = lVar61 + -0x20;
    } while (bVar33);
  }
  if (0 < (ctx->Hooks).Size) {
    lVar58 = 0;
    lVar61 = 0;
    do {
      pIVar12 = (ctx->Hooks).Data;
      if (*(int *)(pIVar12 + lVar58 + 4) == 0) {
        (**(code **)(pIVar12 + lVar58 + 0x10))(ctx,pIVar12 + lVar58);
      }
      lVar61 = lVar61 + 1;
      lVar58 = lVar58 + 0x20;
    } while (lVar61 < (ctx->Hooks).Size);
  }
  ctx->ConfigFlagsLastFrame = ctx->ConfigFlagsCurrFrame;
  pIVar31 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x2197,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).DeltaTime <= 0.0) && (GImGui->FrameCount != 0)) {
    __assert_fail("(g.IO.DeltaTime > 0.0f || g.FrameCount == 0) && \"Need a positive DeltaTime!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x2198,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  iVar51 = GImGui->FrameCount;
  if ((iVar51 != 0) && (GImGui->FrameCountEnded != iVar51)) {
    __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x2199,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x219a,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  pIVar13 = (GImGui->IO).Fonts;
  if (((pIVar13->Fonts).Size < 1) || ((pIVar13->TexReady & 1U) == 0)) {
    __assert_fail("g.IO.Fonts->IsBuilt() && \"Font Atlas not built! Make sure you called ImGui_ImplXXXX_NewFrame() function for renderer backend, which should call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8()\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x219b,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x219c,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->Style).CircleTessellationMaxError <= 0.0) {
    __assert_fail("g.Style.CircleTessellationMaxError > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x219d,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  fVar62 = (GImGui->Style).Alpha;
  if ((fVar62 < 0.0) || (1.0 < fVar62)) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x219e,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->Style).WindowMinSize.x < 1.0) || ((GImGui->Style).WindowMinSize.y < 1.0)) {
    __assert_fail("g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && \"Invalid style setting.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x219f,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (2 < (GImGui->Style).WindowMenuButtonPosition + 1U) {
    __assert_fail("g.Style.WindowMenuButtonPosition == ImGuiDir_None || g.Style.WindowMenuButtonPosition == ImGuiDir_Left || g.Style.WindowMenuButtonPosition == ImGuiDir_Right"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x21a0,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  lVar58 = 0;
  do {
    if (0x200 < (GImGui->IO).KeyMap[lVar58 + 0x200] + 1U) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ImGuiKey_LegacyNativeKey_END && \"io.KeyMap[] contains an out of bound value (need to be 0..511, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                    ,0x21a3,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    lVar58 = lVar58 + 1;
  } while (lVar58 != 0x85);
  uVar44 = (GImGui->IO).ConfigFlags;
  if ((((uVar44 & 1) != 0) && ((GImGui->IO).BackendUsingLegacyKeyArrays == '\x01')) &&
     ((GImGui->IO).KeyMap[0x20c] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x21a7,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).ConfigWindowsResizeFromEdges == true) && (((GImGui->IO).BackendFlags & 2) == 0))
  {
    (GImGui->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (((uVar44 & 0x40) != 0 && iVar51 == 1) && ((pIVar31->ConfigFlagsLastFrame & 0x40) == 0)) {
    __assert_fail("0 && \"Please set DockingEnable before the first call to NewFrame()! Otherwise you will lose your .ini settings!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x21b0,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((uVar44 >> 10 & 1) != 0 && iVar51 == 1) && ((pIVar31->ConfigFlagsLastFrame & 0x400) == 0)) {
    __assert_fail("0 && \"Please set ViewportsEnable before the first call to NewFrame()! Otherwise you will lose your .ini settings!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x21b2,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((uVar44 >> 10 & 1) == 0) {
LAB_00152d4b:
    ctx->ConfigFlagsCurrFrame = (ctx->IO).ConfigFlags;
    if (pIVar31->SettingsLoaded == false) {
      if ((pIVar31->SettingsWindows).Buf.Size != 0) {
        __assert_fail("g.SettingsWindows.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                      ,0x2fb7,"void ImGui::UpdateSettings()");
      }
      pcVar47 = (pIVar31->IO).IniFilename;
      if (pcVar47 != (char *)0x0) {
        LoadIniSettingsFromDisk(pcVar47);
      }
      pIVar31->SettingsLoaded = true;
    }
    if ((0.0 < pIVar31->SettingsDirtyTimer) &&
       (fVar62 = pIVar31->SettingsDirtyTimer - (pIVar31->IO).DeltaTime,
       pIVar31->SettingsDirtyTimer = fVar62, fVar62 <= 0.0)) {
      pcVar47 = (pIVar31->IO).IniFilename;
      if (pcVar47 == (char *)0x0) {
        (pIVar31->IO).WantSaveIniSettings = true;
      }
      else {
        SaveIniSettingsToDisk(pcVar47);
      }
      pIVar31->SettingsDirtyTimer = 0.0;
    }
    ctx->Time = (double)(ctx->IO).DeltaTime + ctx->Time;
    ctx->WithinFrameScope = true;
    ctx->FrameCount = ctx->FrameCount + 1;
    ctx->TooltipOverrideCount = 0;
    ctx->WindowsActiveCount = 0;
    iVar51 = (ctx->MenusIdSubmittedThisFrame).Capacity;
    if (iVar51 < 0) {
      uVar44 = iVar51 / 2 + iVar51;
      uVar46 = 0;
      if (0 < (int)uVar44) {
        uVar46 = (ulong)uVar44;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar26 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar26 = *piVar26 + 1;
      }
      __dest = (uint *)(*GImAllocatorAllocFunc)(uVar46 * 4,GImAllocatorUserData);
      puVar15 = (ctx->MenusIdSubmittedThisFrame).Data;
      if (puVar15 != (uint *)0x0) {
        memcpy(__dest,puVar15,(long)(ctx->MenusIdSubmittedThisFrame).Size << 2);
        puVar15 = (ctx->MenusIdSubmittedThisFrame).Data;
        if ((puVar15 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar26 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar26 = *piVar26 + -1;
        }
        (*GImAllocatorFreeFunc)(puVar15,GImAllocatorUserData);
      }
      (ctx->MenusIdSubmittedThisFrame).Data = __dest;
      (ctx->MenusIdSubmittedThisFrame).Capacity = (int)uVar46;
    }
    (ctx->MenusIdSubmittedThisFrame).Size = 0;
    fVar62 = (ctx->IO).DeltaTime;
    iVar51 = ctx->FramerateSecPerFrameIdx;
    ctx->FramerateSecPerFrameAccum =
         (fVar62 - ctx->FramerateSecPerFrame[iVar51]) + ctx->FramerateSecPerFrameAccum;
    ctx->FramerateSecPerFrame[iVar51] = fVar62;
    iVar37 = iVar51 + (int)((ulong)((long)(iVar51 + 1) * -0x77777777) >> 0x20) + 1;
    ctx->FramerateSecPerFrameIdx = iVar51 + 1 + ((iVar37 >> 6) - (iVar37 >> 0x1f)) * -0x78;
    iVar51 = 0x77;
    if (ctx->FramerateSecPerFrameCount < 0x77) {
      iVar51 = ctx->FramerateSecPerFrameCount;
    }
    ctx->FramerateSecPerFrameCount = iVar51 + 1;
    uVar44 = -(uint)(0.0 < ctx->FramerateSecPerFrameAccum);
    (ctx->IO).Framerate =
         (float)(~uVar44 & 0x7f7fffff |
                (uint)(1.0 / (ctx->FramerateSecPerFrameAccum / (float)(iVar51 + 1))) & uVar44);
    pIVar31 = GImGui;
    iVar51 = (GImGui->Viewports).Size;
    if (iVar51 < (GImGui->PlatformIO).Viewports.Size) {
      __assert_fail("g.PlatformIO.Viewports.Size <= g.Viewports.Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                    ,0x31c5,"void ImGui::UpdateViewportsNewFrame()");
    }
    uVar44 = GImGui->ConfigFlagsCurrFrame;
    if (0 < iVar51 && (uVar44 >> 10 & 1) != 0) {
      lVar58 = 0;
      do {
        p_Var16 = (pIVar31->PlatformIO).Platform_GetWindowMinimized;
        if ((p_Var16 != (_func_bool_ImGuiViewport_ptr *)0x0) &&
           (pIVar39 = (pIVar31->Viewports).Data[lVar58], pIVar39->PlatformWindowCreated == true)) {
          bVar33 = (*p_Var16)(&pIVar39->super_ImGuiViewport);
          (pIVar39->super_ImGuiViewport).Flags =
               (uint)bVar33 << 10 | (pIVar39->super_ImGuiViewport).Flags & 0xfffffbffU;
        }
        lVar58 = lVar58 + 1;
      } while (lVar58 < (pIVar31->Viewports).Size);
    }
    if (0 < (pIVar31->Viewports).Size) {
      pIVar40 = (ImGuiContext *)*(pIVar31->Viewports).Data;
      iVar51._0_1_ = pIVar40->Initialized;
      iVar51._1_1_ = pIVar40->FontAtlasOwnedByContext;
      iVar51._2_2_ = *(undefined2 *)&pIVar40->field_0x2;
      if (iVar51 != 0x11111111) {
        __assert_fail("main_viewport->ID == IMGUI_VIEWPORT_DEFAULT_ID",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                      ,0x31dd,"void ImGui::UpdateViewportsNewFrame()");
      }
      if (*(long *)&(pIVar40->IO).ConfigMemoryCompactTimer != 0) {
        __assert_fail("main_viewport->Window == __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                      ,0x31de,"void ImGui::UpdateViewportsNewFrame()");
      }
      if ((uVar44 >> 10 & 1) == 0) {
        local_a8.Min.x = 0.0;
        local_a8.Min.y = 0.0;
      }
      else {
        local_a8.Min = (*(pIVar31->PlatformIO).Platform_GetWindowPos)((ImGuiViewport *)pIVar40);
      }
      local_50 = (pIVar31->IO).DisplaySize;
      if (((uVar44 >> 10 & 1) != 0) && ((pIVar40->field_0x5 & 4) != 0)) {
        local_a8.Min.x = (float)(pIVar40->IO).ConfigFlags;
        local_a8.Min.y = (float)(pIVar40->IO).BackendFlags;
        local_50 = (pIVar40->IO).DisplaySize;
      }
      local_88._0_8_ = pIVar40;
      uVar46 = 0;
      AddUpdateViewport((ImGuiWindow *)0x0,0x11111111,&local_a8.Min,&local_50,0x1004);
      pIVar31->CurrentDpiScale = 0.0;
      pIVar31->CurrentViewport = (ImGuiViewportP *)0x0;
      pIVar31->MouseViewport = (ImGuiViewportP *)0x0;
      pIVar59 = pIVar40;
      if (0 < (pIVar31->Viewports).Size) {
        do {
          iVar51 = (int)uVar46;
          if (iVar51 < 0) goto LAB_001569dc;
          pIVar39 = (pIVar31->Viewports).Data[uVar46];
          *(int *)&(pIVar39->super_ImGuiViewport).field_0x5c = iVar51;
          pIVar40 = GImGui;
          if ((iVar51 == 0) || (pIVar31->FrameCount + -2 <= pIVar39->LastFrameActive)) {
            bVar33 = pIVar39->PlatformWindowCreated;
            pIVar40 = (ImGuiContext *)CONCAT71((int7)((ulong)pIVar59 >> 8),bVar33);
            if (((uVar44 >> 10 & 1) != 0) &&
               ((((pIVar39->super_ImGuiViewport).Flags & 0x400) == 0 & bVar33) == 1)) {
              if ((pIVar39->super_ImGuiViewport).PlatformRequestMove == true) {
                IVar64 = (*(pIVar31->PlatformIO).Platform_GetWindowPos)
                                   (&pIVar39->super_ImGuiViewport);
                pIVar39->LastPlatformPos = IVar64;
                (pIVar39->super_ImGuiViewport).Pos = IVar64;
              }
              if ((pIVar39->super_ImGuiViewport).PlatformRequestResize == true) {
                IVar64 = (*(pIVar31->PlatformIO).Platform_GetWindowSize)
                                   (&pIVar39->super_ImGuiViewport);
                pIVar39->LastPlatformSize = IVar64;
                (pIVar39->super_ImGuiViewport).Size = IVar64;
              }
            }
            UpdateViewportPlatformMonitor(pIVar39);
            pIVar39->WorkOffsetMin = pIVar39->BuildWorkOffsetMin;
            pIVar39->WorkOffsetMax = pIVar39->BuildWorkOffsetMax;
            (pIVar39->BuildWorkOffsetMin).x = 0.0;
            (pIVar39->BuildWorkOffsetMin).y = 0.0;
            (pIVar39->BuildWorkOffsetMax).x = 0.0;
            (pIVar39->BuildWorkOffsetMax).y = 0.0;
            fVar62 = (pIVar39->super_ImGuiViewport).Pos.x;
            fVar80 = (pIVar39->super_ImGuiViewport).Pos.y;
            fVar78 = (pIVar39->WorkOffsetMin).x;
            fVar73 = (pIVar39->WorkOffsetMin).y;
            fVar74 = ((pIVar39->super_ImGuiViewport).Size.x - fVar78) + (pIVar39->WorkOffsetMax).x;
            fVar79 = ((pIVar39->super_ImGuiViewport).Size.y - fVar73) + (pIVar39->WorkOffsetMax).y;
            (pIVar39->super_ImGuiViewport).WorkPos.x = fVar62 + fVar78;
            (pIVar39->super_ImGuiViewport).WorkPos.y = fVar80 + fVar73;
            (pIVar39->super_ImGuiViewport).WorkSize.x =
                 (float)(~-(uint)(fVar74 <= 0.0) & (uint)fVar74);
            (pIVar39->super_ImGuiViewport).WorkSize.y =
                 (float)(~-(uint)(fVar79 <= 0.0) & (uint)fVar79);
            pIVar39->Alpha = 1.0;
            if ((((pIVar39->super_ImGuiViewport).Flags & 0x1000) != 0) &&
               ((((fVar62 = fVar62 - (pIVar39->LastPos).x, fVar62 != 0.0 || (NAN(fVar62))) ||
                 (fVar80 = fVar80 - (pIVar39->LastPos).y, fVar80 != 0.0)) || (NAN(fVar80))))) {
              TranslateWindowsInViewport
                        (pIVar39,&pIVar39->LastPos,&(pIVar39->super_ImGuiViewport).Pos);
            }
            p_Var19 = (pIVar31->PlatformIO).Platform_GetWindowDpiScale;
            if ((p_Var19 == (_func_float_ImGuiViewport_ptr *)0x0) || (bVar33 == false)) {
              uVar81 = (uint)pIVar39->PlatformMonitor;
              if (uVar81 == 0xffffffff) {
                fVar62 = (pIVar39->super_ImGuiViewport).DpiScale;
                uVar81 = -(uint)(fVar62 != 0.0);
                uVar70 = 0;
                fVar62 = (float)(~uVar81 & 0x3f800000 | (uint)fVar62 & uVar81);
                uVar71 = 0;
                uVar72 = 0;
              }
              else {
                if ((pIVar39->PlatformMonitor < 0) ||
                   ((pIVar31->PlatformIO).Monitors.Size <= (int)uVar81)) {
                  pcVar47 = 
                  "T &ImVector<ImGuiPlatformMonitor>::operator[](int) [T = ImGuiPlatformMonitor]";
                  goto LAB_00156b70;
                }
                fVar62 = (pIVar31->PlatformIO).Monitors.Data[uVar81].DpiScale;
                uVar70 = 0;
                uVar71 = 0;
                uVar72 = 0;
              }
            }
            else {
              fVar62 = (*p_Var19)(&pIVar39->super_ImGuiViewport);
              uVar70 = extraout_var._0_4_;
              uVar71 = extraout_var._4_4_;
              uVar72 = extraout_var._8_4_;
            }
            fVar80 = (pIVar39->super_ImGuiViewport).DpiScale;
            if ((fVar80 != 0.0) || (NAN(fVar80))) {
              if (((fVar62 != fVar80) || (NAN(fVar62) || NAN(fVar80))) &&
                 (((pIVar31->IO).ConfigFlags & 0x4000) != 0)) {
                local_98._4_4_ = uVar70;
                local_98._0_4_ = fVar62;
                local_98._8_4_ = uVar71;
                local_98._12_4_ = uVar72;
                ScaleWindowsInViewport(pIVar39,fVar62 / fVar80);
                fVar62 = (float)local_98._0_4_;
              }
            }
            (pIVar39->super_ImGuiViewport).DpiScale = fVar62;
            uVar46 = (ulong)(iVar51 + 1);
          }
          else {
            lVar58 = (long)(GImGui->Windows).Size;
            if (0 < lVar58) {
              ppIVar17 = (GImGui->Windows).Data;
              lVar61 = 0;
              do {
                pIVar42 = ppIVar17[lVar61];
                if (pIVar42->Viewport == pIVar39) {
                  pIVar42->Viewport = (ImGuiViewportP *)0x0;
                  pIVar42->ViewportOwned = false;
                }
                lVar61 = lVar61 + 1;
              } while (lVar58 != lVar61);
            }
            if (pIVar40->MouseLastHoveredViewport == pIVar39) {
              pIVar40->MouseLastHoveredViewport = (ImGuiViewportP *)0x0;
            }
            DestroyPlatformWindow(pIVar39);
            ppIVar18 = (pIVar40->PlatformIO).Viewports.Data;
            ppIVar38 = ppIVar18;
            while (ppIVar38 < ppIVar18 + (pIVar40->PlatformIO).Viewports.Size) {
              pIVar45 = (ImGuiViewportP *)*ppIVar38;
              ppIVar38 = ppIVar38 + 1;
              if (pIVar45 == pIVar39) {
                __assert_fail("g.PlatformIO.Viewports.contains(viewport) == false",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                              ,0x32d7,"void ImGui::DestroyViewport(ImGuiViewportP *)");
              }
            }
            iVar51 = *(int *)&(pIVar39->super_ImGuiViewport).field_0x5c;
            uVar49 = (ulong)iVar51;
            if (((long)uVar49 < 0) || (iVar37 = (pIVar40->Viewports).Size, iVar37 <= iVar51))
            goto LAB_001569dc;
            ppIVar20 = (pIVar40->Viewports).Data;
            if (ppIVar20[uVar49] != pIVar39) {
              __assert_fail("g.Viewports[viewport->Idx] == viewport",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                            ,0x32d8,"void ImGui::DestroyViewport(ImGuiViewportP *)");
            }
            ppIVar20 = ppIVar20 + uVar49;
            memmove(ppIVar20,ppIVar20 + 1,(~uVar49 + (long)iVar37) * 8);
            (pIVar40->Viewports).Size = (pIVar40->Viewports).Size + -1;
            IM_DELETE<ImGuiViewportP>(pIVar39);
          }
          iVar51 = (pIVar31->Viewports).Size;
          pIVar59 = pIVar40;
        } while ((int)uVar46 < iVar51);
        uVar46 = (ulong)(0 < iVar51);
      }
      if ((pIVar31->PlatformIO).Monitors.Size == 0) {
        (pIVar31->FallbackMonitor).MainPos = ((ImGuiViewport *)local_88._0_8_)->Pos;
        (pIVar31->FallbackMonitor).MainSize = ((ImGuiViewport *)local_88._0_8_)->Size;
        (pIVar31->FallbackMonitor).WorkPos = ((ImGuiViewport *)local_88._0_8_)->WorkPos;
        (pIVar31->FallbackMonitor).WorkSize = ((ImGuiViewport *)local_88._0_8_)->WorkSize;
        (pIVar31->FallbackMonitor).DpiScale = ((ImGuiViewport *)local_88._0_8_)->DpiScale;
      }
      if ((uVar44 >> 10 & 1) == 0) {
        pIVar31->MouseViewport = (ImGuiViewportP *)local_88._0_8_;
      }
      else {
        if (((pIVar31->IO).BackendFlags & 0x800) == 0) {
LAB_0015346e:
          pIVar39 = FindHoveredViewportFromPlatformWindowStack(&(pIVar31->IO).MousePos);
        }
        else {
          IVar52 = (pIVar31->IO).MouseHoveredViewport;
          if ((IVar52 != 0) && (lVar58 = (long)(GImGui->Viewports).Size, 0 < lVar58)) {
            lVar61 = 0;
            do {
              pIVar39 = (GImGui->Viewports).Data[lVar61];
              if ((pIVar39->super_ImGuiViewport).ID == IVar52) goto LAB_00153463;
              lVar61 = lVar61 + 1;
            } while (lVar58 != lVar61);
          }
          pIVar39 = (ImGuiViewportP *)0x0;
LAB_00153463:
          if (pIVar39 == (ImGuiViewportP *)0x0) {
            pIVar39 = (ImGuiViewportP *)0x0;
          }
          else if (((pIVar39->super_ImGuiViewport).Flags & 0x80) != 0) goto LAB_0015346e;
        }
        pIVar45 = pIVar39;
        if (pIVar39 == (ImGuiViewportP *)0x0) {
          if (pIVar31->MouseLastHoveredViewport == (ImGuiViewportP *)0x0) {
            if ((char)uVar46 == '\0') goto LAB_001569dc;
            pIVar45 = *(pIVar31->Viewports).Data;
            goto LAB_00153499;
          }
        }
        else {
LAB_00153499:
          pIVar31->MouseLastHoveredViewport = pIVar45;
        }
        if ((pIVar31->MovingWindow == (ImGuiWindow *)0x0) ||
           (pIVar45 = pIVar31->MovingWindow->Viewport, pIVar45 == (ImGuiViewportP *)0x0)) {
          pIVar45 = pIVar31->MouseLastHoveredViewport;
        }
        pIVar31->MouseViewport = pIVar45;
        if (pIVar31->DragDropActive == true && pIVar39 == (ImGuiViewportP *)0x0) {
          pIVar39 = pIVar31->MouseLastHoveredViewport;
        }
        if ((pIVar31->DragDropActive == false) && (pIVar31->ActiveId != 0)) {
          bVar33 = true;
          if ((GImGui->IO).MouseDown[0] == false) {
            uVar46 = 0;
            do {
              uVar49 = uVar46;
              if (uVar49 == 4) {
                uVar49 = 4;
                break;
              }
              uVar46 = uVar49 + 1;
            } while ((GImGui->IO).MouseDown[uVar49 + 1] != true);
            bVar33 = uVar49 < 4;
          }
          if (!bVar33) goto LAB_00153565;
        }
        else {
LAB_00153565:
          if (((pIVar39 != (ImGuiViewportP *)0x0) && (pIVar39 != pIVar45)) &&
             (((pIVar39->super_ImGuiViewport).Flags & 0x80) == 0)) {
            pIVar31->MouseViewport = pIVar39;
          }
        }
        if (pIVar31->MouseViewport == (ImGuiViewportP *)0x0) {
          __assert_fail("g.MouseViewport != __null",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                        ,0x326d,"void ImGui::UpdateViewportsNewFrame()");
        }
      }
      ((ctx->IO).Fonts)->Locked = true;
      font = (GImGui->IO).FontDefault;
      if (font == (ImFont *)0x0) {
        pIVar13 = (GImGui->IO).Fonts;
        if ((pIVar13->Fonts).Size < 1) {
          pcVar47 = "T &ImVector<ImFont *>::operator[](int) [T = ImFont *]";
          goto LAB_00156b70;
        }
        font = *(pIVar13->Fonts).Data;
      }
      SetCurrentFont(font);
      if (ctx->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
        __assert_fail("g.Font->IsLoaded()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                      ,0x1167,"void ImGui::NewFrame()");
      }
      lVar58 = (long)(ctx->Viewports).Size;
      if (lVar58 < 1) {
        fVar62 = -3.4028235e+38;
        fVar80 = 3.4028235e+38;
        fVar78 = 3.4028235e+38;
        fVar73 = -3.4028235e+38;
      }
      else {
        fVar78 = 3.4028235e+38;
        lVar61 = 0;
        fVar62 = -3.4028235e+38;
        fVar80 = 3.4028235e+38;
        fVar74 = -3.4028235e+38;
        do {
          pIVar39 = (ctx->Viewports).Data[lVar61];
          fVar79 = (pIVar39->super_ImGuiViewport).Pos.x;
          fVar75 = (pIVar39->super_ImGuiViewport).Pos.y;
          fVar73 = (pIVar39->super_ImGuiViewport).Size.x + fVar79;
          if (fVar73 <= fVar62) {
            fVar73 = fVar62;
          }
          fVar62 = fVar73;
          fVar73 = (pIVar39->super_ImGuiViewport).Size.y + fVar75;
          if (fVar73 <= fVar74) {
            fVar73 = fVar74;
          }
          if (fVar80 <= fVar79) {
            fVar79 = fVar80;
          }
          fVar80 = fVar79;
          if (fVar78 <= fVar75) {
            fVar75 = fVar78;
          }
          fVar78 = fVar75;
          lVar61 = lVar61 + 1;
          fVar74 = fVar73;
        } while (lVar58 != lVar61);
      }
      (ctx->DrawListSharedData).ClipRectFullscreen.x = fVar80;
      (ctx->DrawListSharedData).ClipRectFullscreen.y = fVar78;
      (ctx->DrawListSharedData).ClipRectFullscreen.z = fVar62;
      (ctx->DrawListSharedData).ClipRectFullscreen.w = fVar73;
      fVar62 = (ctx->Style).CircleTessellationMaxError;
      (ctx->DrawListSharedData).CurveTessellationTol = (ctx->Style).CurveTessellationTol;
      ImDrawListSharedData::SetCircleTessellationMaxError(&ctx->DrawListSharedData,fVar62);
      uVar44 = (uint)(ctx->Style).AntiAliasedLines;
      (ctx->DrawListSharedData).InitialFlags = uVar44;
      if (((ctx->Style).AntiAliasedLinesUseTex != false) &&
         ((ctx->Font->ContainerAtlas->Flags & 4) == 0)) {
        (ctx->DrawListSharedData).InitialFlags = uVar44 | 2;
      }
      if ((ctx->Style).AntiAliasedFill == true) {
        pIVar2 = &(ctx->DrawListSharedData).InitialFlags;
        *(byte *)pIVar2 = (byte)*pIVar2 | 4;
      }
      if (((ctx->IO).BackendFlags & 8) != 0) {
        pIVar2 = &(ctx->DrawListSharedData).InitialFlags;
        *(byte *)pIVar2 = (byte)*pIVar2 | 8;
      }
      if (0 < (ctx->Viewports).Size) {
        lVar58 = 0;
        do {
          pIVar39 = (ctx->Viewports).Data[lVar58];
          (pIVar39->super_ImGuiViewport).DrawData = (ImDrawData *)0x0;
          (pIVar39->DrawDataP).Valid = false;
          *(undefined3 *)&(pIVar39->DrawDataP).field_0x1 = 0;
          (pIVar39->DrawDataP).CmdListsCount = 0;
          (pIVar39->DrawDataP).TotalIdxCount = 0;
          (pIVar39->DrawDataP).TotalVtxCount = 0;
          (pIVar39->DrawDataP).CmdLists = (ImDrawList **)0x0;
          (pIVar39->DrawDataP).DisplayPos.x = 0.0;
          (pIVar39->DrawDataP).DisplayPos.y = 0.0;
          (pIVar39->DrawDataP).DisplaySize.x = 0.0;
          (pIVar39->DrawDataP).DisplaySize.y = 0.0;
          (pIVar39->DrawDataP).FramebufferScale.x = 0.0;
          (pIVar39->DrawDataP).FramebufferScale.y = 0.0;
          (pIVar39->DrawDataP).OwnerViewport = (ImGuiViewport *)0x0;
          lVar58 = lVar58 + 1;
        } while (lVar58 < (ctx->Viewports).Size);
      }
      pIVar31 = GImGui;
      if ((ctx->DragDropActive != false) &&
         (IVar52 = (ctx->DragDropPayload).SourceId, IVar52 == ctx->ActiveId)) {
        if (GImGui->ActiveId == IVar52) {
          GImGui->ActiveIdIsAlive = IVar52;
        }
        if (pIVar31->ActiveIdPreviousFrame == IVar52) {
          pIVar31->ActiveIdPreviousFrameIsAlive = true;
        }
      }
      if (ctx->HoveredIdPreviousFrame == 0) {
        ctx->HoveredIdTimer = 0.0;
LAB_00153783:
        ctx->HoveredIdNotActiveTimer = 0.0;
      }
      else if ((ctx->HoveredId != 0) && (ctx->ActiveId == ctx->HoveredId)) goto LAB_00153783;
      IVar52 = ctx->HoveredId;
      if ((IVar52 != 0) &&
         (ctx->HoveredIdTimer = (ctx->IO).DeltaTime + ctx->HoveredIdTimer, ctx->ActiveId != IVar52))
      {
        ctx->HoveredIdNotActiveTimer = (ctx->IO).DeltaTime + ctx->HoveredIdNotActiveTimer;
      }
      ctx->HoveredIdPreviousFrame = IVar52;
      ctx->HoveredIdPreviousFrameUsingMouseWheel = ctx->HoveredIdUsingMouseWheel;
      ctx->HoveredId = 0;
      ctx->HoveredIdAllowOverlap = false;
      ctx->HoveredIdUsingMouseWheel = false;
      ctx->HoveredIdDisabled = false;
      IVar52 = ctx->ActiveId;
      if (((ctx->ActiveIdIsAlive != IVar52) && (IVar52 != 0)) &&
         (ctx->ActiveIdPreviousFrame == IVar52)) {
        ClearActiveID();
      }
      IVar52 = ctx->ActiveId;
      if (IVar52 != 0) {
        ctx->ActiveIdTimer = (ctx->IO).DeltaTime + ctx->ActiveIdTimer;
      }
      ctx->LastActiveIdTimer = (ctx->IO).DeltaTime + ctx->LastActiveIdTimer;
      ctx->ActiveIdPreviousFrame = IVar52;
      ctx->ActiveIdPreviousFrameWindow = ctx->ActiveIdWindow;
      ctx->ActiveIdPreviousFrameHasBeenEditedBefore = ctx->ActiveIdHasBeenEditedBefore;
      ctx->ActiveIdIsAlive = 0;
      ctx->ActiveIdHasBeenEditedThisFrame = false;
      ctx->ActiveIdPreviousFrameIsAlive = false;
      ctx->ActiveIdIsJustActivated = false;
      if (IVar52 != ctx->TempInputId && ctx->TempInputId != 0) {
        ctx->TempInputId = 0;
      }
      if (IVar52 == 0) {
        (ctx->ActiveIdUsingKeyInputMask).Storage[1] = 0;
        (ctx->ActiveIdUsingKeyInputMask).Storage[2] = 0;
        (ctx->ActiveIdUsingKeyInputMask).Storage[3] = 0;
        (ctx->ActiveIdUsingKeyInputMask).Storage[4] = 0;
        ctx->ActiveIdUsingNavDirMask = 0;
        ctx->ActiveIdUsingNavInputMask = 0;
        (ctx->ActiveIdUsingKeyInputMask).Storage[0] = 0;
        (ctx->ActiveIdUsingKeyInputMask).Storage[1] = 0;
      }
      ctx->DragDropAcceptIdPrev = ctx->DragDropAcceptIdCurr;
      ctx->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
      ctx->DragDropAcceptIdCurr = 0;
      ctx->DragDropWithinSource = false;
      ctx->DragDropWithinTarget = false;
      ctx->DragDropHoldJustPressedId = 0;
      iVar51 = (ctx->InputEventsTrail).Capacity;
      if (iVar51 < 0) {
        uVar44 = iVar51 / 2 + iVar51;
        uVar46 = 0;
        if (0 < (int)uVar44) {
          uVar46 = (ulong)uVar44;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar26 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar26 = *piVar26 + 1;
        }
        pIVar40 = (ImGuiContext *)(*GImAllocatorAllocFunc)(uVar46 * 0x18,GImAllocatorUserData);
        pIVar21 = (ctx->InputEventsTrail).Data;
        if (pIVar21 != (ImGuiInputEvent *)0x0) {
          memcpy(pIVar40,pIVar21,(long)(ctx->InputEventsTrail).Size * 0x18);
          pIVar21 = (ctx->InputEventsTrail).Data;
          if ((pIVar21 != (ImGuiInputEvent *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar26 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar26 = *piVar26 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar21,GImAllocatorUserData);
        }
        (ctx->InputEventsTrail).Data = (ImGuiInputEvent *)pIVar40;
        (ctx->InputEventsTrail).Capacity = (int)uVar46;
      }
      (ctx->InputEventsTrail).Size = 0;
      UpdateInputEvents((ctx->IO).ConfigInputTrickleEventQueue);
      pIVar31 = GImGui;
      if ((GImGui->IO).BackendUsingLegacyKeyArrays == '\0') {
        pIVar40 = (ImGuiContext *)0x0;
        do {
          if (((pIVar31->IO).KeysDown[(long)pIVar40] != false) &&
             (pIVar41 = GetKeyData((ImGuiKey)pIVar40), pIVar41->Down != true)) {
            __assert_fail("(io.KeysDown[n] == false || IsKeyDown(n)) && \"Backend needs to either only use io.AddKeyEvent(), either only fill legacy io.KeysDown[] + io.KeyMap[]. Not both!\""
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                          ,0x100d,"void ImGui::UpdateKeyboardInputs()");
          }
          pIVar40 = (ImGuiContext *)((long)pIVar40 + 1);
        } while (pIVar40 != (ImGuiContext *)0x200);
      }
      else {
        if (GImGui->FrameCount == 0) {
          lVar58 = 0;
          do {
            if ((GImGui->IO).KeyMap[lVar58] != -1) {
              __assert_fail("g.IO.KeyMap[n] == -1 && \"Backend is not allowed to write to io.KeyMap[0..511]!\""
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                            ,0x1013,"void ImGui::UpdateKeyboardInputs()");
            }
            lVar58 = lVar58 + 1;
          } while (lVar58 != 0x200);
        }
        lVar58 = 0;
        do {
          uVar44 = (pIVar31->IO).KeyMap[lVar58 + 0x200];
          if ((ulong)uVar44 != 0xffffffff) {
            if (0x1ff < uVar44) {
              __assert_fail("IsLegacyKey((ImGuiKey)io.KeyMap[n])",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                            ,0x1019,"void ImGui::UpdateKeyboardInputs()");
            }
            (pIVar31->IO).KeyMap[uVar44] = (int)lVar58 + 0x200;
          }
          lVar58 = lVar58 + 1;
        } while (lVar58 != 0x85);
        uVar46 = 0;
        do {
          bVar33 = (pIVar31->IO).KeysDown[uVar46];
          if ((bVar33 != false) || ((pIVar31->IO).BackendUsingLegacyKeyArrays == '\x01')) {
            uVar44 = (pIVar31->IO).KeyMap[uVar46];
            uVar81 = (uint)uVar46;
            if (uVar44 != 0xffffffff) {
              uVar81 = uVar44;
            }
            if (0x84 < uVar81 - 0x200 && uVar44 != 0xffffffff) {
              __assert_fail("io.KeyMap[n] == -1 || IsNamedKey(key)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                            ,0x1022,"void ImGui::UpdateKeyboardInputs()");
            }
            (pIVar31->IO).KeysData[(int)uVar81].Down = bVar33;
            if (uVar46 != uVar81) {
              (pIVar31->IO).KeysDown[(int)uVar81] = (pIVar31->IO).KeysDown[uVar46];
            }
            (pIVar31->IO).BackendUsingLegacyKeyArrays = '\x01';
          }
          uVar46 = uVar46 + 1;
        } while (uVar46 != 0x200);
        if ((pIVar31->IO).BackendUsingLegacyKeyArrays == '\x01') {
          bVar33 = (pIVar31->IO).KeyShift;
          (pIVar31->IO).KeysData[0x281].Down = (pIVar31->IO).KeyCtrl;
          (pIVar31->IO).KeysData[0x282].Down = bVar33;
          (pIVar31->IO).KeysData[0x283].Down = (pIVar31->IO).KeyAlt;
          (pIVar31->IO).KeysData[0x284].Down = (pIVar31->IO).KeySuper;
        }
      }
      pIVar59 = GImGui;
      bVar33 = (GImGui->IO).KeyCtrl;
      bVar34 = (GImGui->IO).KeyShift;
      uVar44 = bVar33 + 2;
      if (bVar34 == false) {
        uVar44 = (uint)bVar33;
      }
      uVar81 = uVar44 + 4;
      if ((GImGui->IO).KeyAlt == false) {
        uVar81 = uVar44;
      }
      uVar44 = uVar81 + 8;
      if ((GImGui->IO).KeySuper == false) {
        uVar44 = uVar81;
      }
      (pIVar31->IO).KeyMods = uVar44;
      if (((pIVar31->IO).BackendFlags & 1) == 0) {
        lVar58 = 0;
        do {
          (&(pIVar31->IO).KeysData[0x269].Down)[lVar58] = false;
          *(undefined4 *)((long)&(pIVar31->IO).KeysData[0x269].AnalogValue + lVar58) = 0;
          lVar58 = lVar58 + 0x10;
        } while (lVar58 != 0x180);
      }
      lVar58 = 0xe18;
      do {
        fVar62 = *(float *)((long)pIVar31 + lVar58 + -4);
        *(float *)(&pIVar31->Initialized + lVar58) = fVar62;
        fVar80 = -1.0;
        if ((*(char *)((long)pIVar31 + lVar58 + -8) == '\x01') && (fVar80 = 0.0, 0.0 <= fVar62)) {
          fVar80 = fVar62 + (pIVar31->IO).DeltaTime;
        }
        *(float *)((long)pIVar31 + lVar58 + -4) = fVar80;
        lVar58 = lVar58 + 0x10;
      } while (lVar58 != 0x3668);
      (pIVar59->IO).WantSetMousePos = false;
      uVar44 = (pIVar59->IO).ConfigFlags;
      if ((uVar44 & 2) == 0) {
        uVar81 = 0;
      }
      else {
        uVar81 = (uint)CONCAT71((int7)((ulong)pIVar31 >> 8),(char)(pIVar59->IO).BackendFlags) &
                 0xffffff01;
      }
      if (((char)uVar81 != '\0') && ((pIVar59->IO).BackendUsingLegacyNavInputArray == false)) {
        lVar58 = 0;
        do {
          fVar62 = (pIVar59->IO).NavInputs[lVar58];
          if ((fVar62 != 0.0) || (NAN(fVar62))) {
            __assert_fail("io.NavInputs[n] == 0.0f && \"Backend needs to either only use io.AddKeyEvent()/io.AddKeyAnalogEvent(), either only fill legacy io.NavInputs[]. Not both!\""
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                          ,0x2a08,"void ImGui::NavUpdate()");
          }
          lVar58 = lVar58 + 1;
        } while (lVar58 != 0x14);
        fVar62 = (pIVar59->IO).KeysData[0x26c].AnalogValue;
        (pIVar59->IO).NavInputs[0] = fVar62;
        if (0.0 < fVar62) {
          pIVar59->NavInputSource = ImGuiInputSource_Gamepad;
        }
        fVar62 = (pIVar59->IO).KeysData[0x26e].AnalogValue;
        (pIVar59->IO).NavInputs[1] = fVar62;
        if (0.0 < fVar62) {
          pIVar59->NavInputSource = ImGuiInputSource_Gamepad;
        }
        fVar62 = (pIVar59->IO).KeysData[0x26d].AnalogValue;
        (pIVar59->IO).NavInputs[3] = fVar62;
        if (0.0 < fVar62) {
          pIVar59->NavInputSource = ImGuiInputSource_Gamepad;
        }
        fVar62 = (pIVar59->IO).KeysData[0x26b].AnalogValue;
        (pIVar59->IO).NavInputs[2] = fVar62;
        if (0.0 < fVar62) {
          pIVar59->NavInputSource = ImGuiInputSource_Gamepad;
        }
        fVar62 = (pIVar59->IO).KeysData[0x271].AnalogValue;
        (pIVar59->IO).NavInputs[4] = fVar62;
        if (0.0 < fVar62) {
          pIVar59->NavInputSource = ImGuiInputSource_Gamepad;
        }
        fVar62 = (pIVar59->IO).KeysData[0x272].AnalogValue;
        (pIVar59->IO).NavInputs[5] = fVar62;
        if (0.0 < fVar62) {
          pIVar59->NavInputSource = ImGuiInputSource_Gamepad;
        }
        fVar62 = (pIVar59->IO).KeysData[0x26f].AnalogValue;
        (pIVar59->IO).NavInputs[6] = fVar62;
        if (0.0 < fVar62) {
          pIVar59->NavInputSource = ImGuiInputSource_Gamepad;
        }
        fVar62 = (pIVar59->IO).KeysData[0x270].AnalogValue;
        (pIVar59->IO).NavInputs[7] = fVar62;
        if (0.0 < fVar62) {
          pIVar59->NavInputSource = ImGuiInputSource_Gamepad;
        }
        fVar62 = (pIVar59->IO).KeysData[0x273].AnalogValue;
        fVar80 = (pIVar59->IO).KeysData[0x274].AnalogValue;
        (pIVar59->IO).NavInputs[0xc] = fVar62;
        (pIVar59->IO).NavInputs[0xd] = fVar80;
        (pIVar59->IO).NavInputs[0xe] = fVar62;
        (pIVar59->IO).NavInputs[0xf] = fVar80;
        (pIVar59->IO).NavInputs[8] = (pIVar59->IO).KeysData[0x27b].AnalogValue;
        (pIVar59->IO).NavInputs[9] = (pIVar59->IO).KeysData[0x27c].AnalogValue;
        (pIVar59->IO).NavInputs[10] = (pIVar59->IO).KeysData[0x279].AnalogValue;
        (pIVar59->IO).NavInputs[0xb] = (pIVar59->IO).KeysData[0x27a].AnalogValue;
      }
      if ((uVar44 & 1) != 0) {
        if ((pIVar59->IO).KeysData[0x20c].Down == true) {
          (pIVar59->IO).NavInputs[0] = 1.0;
          pIVar59->NavInputSource = ImGuiInputSource_Keyboard;
        }
        if ((pIVar59->IO).KeysData[0x20d].Down == true) {
          (pIVar59->IO).NavInputs[2] = 1.0;
          pIVar59->NavInputSource = ImGuiInputSource_Keyboard;
        }
        if ((pIVar59->IO).KeysData[0x20e].Down == true) {
          (pIVar59->IO).NavInputs[1] = 1.0;
          pIVar59->NavInputSource = ImGuiInputSource_Keyboard;
        }
        if ((pIVar59->IO).KeysData[0x201].Down == true) {
          (pIVar59->IO).NavInputs[0x10] = 1.0;
          pIVar59->NavInputSource = ImGuiInputSource_Keyboard;
        }
        if ((pIVar59->IO).KeysData[0x202].Down == true) {
          (pIVar59->IO).NavInputs[0x11] = 1.0;
          pIVar59->NavInputSource = ImGuiInputSource_Keyboard;
        }
        if ((pIVar59->IO).KeysData[0x203].Down == true) {
          (pIVar59->IO).NavInputs[0x12] = 1.0;
          pIVar59->NavInputSource = ImGuiInputSource_Keyboard;
        }
        if ((pIVar59->IO).KeysData[0x204].Down == true) {
          (pIVar59->IO).NavInputs[0x13] = 1.0;
          pIVar59->NavInputSource = ImGuiInputSource_Keyboard;
        }
        if (bVar33 != false) {
          (pIVar59->IO).NavInputs[0xe] = 1.0;
        }
        if (bVar34 != false) {
          (pIVar59->IO).NavInputs[0xf] = 1.0;
        }
      }
      pfVar7 = (pIVar59->IO).NavInputsDownDuration;
      pfVar54 = pfVar7;
      pfVar56 = (pIVar59->IO).NavInputsDownDurationPrev;
      for (lVar58 = 0x14; lVar58 != 0; lVar58 = lVar58 + -1) {
        *pfVar56 = *pfVar54;
        pfVar54 = pfVar54 + (ulong)bVar57 * -2 + 1;
        pfVar56 = pfVar56 + (ulong)bVar57 * -2 + 1;
      }
      lVar58 = 0;
      do {
        fVar62 = -1.0;
        if (0.0 < (pIVar59->IO).NavInputs[lVar58]) {
          fVar62 = 0.0;
          if (0.0 <= pfVar7[lVar58]) {
            fVar62 = pfVar7[lVar58] + (pIVar59->IO).DeltaTime;
          }
        }
        pfVar7[lVar58] = fVar62;
        lVar58 = lVar58 + 1;
      } while (lVar58 != 0x14);
      if (pIVar59->NavInitResultId != 0) {
        NavInitRequestApplyResult();
      }
      pIVar59->NavInitRequest = false;
      pIVar59->NavInitRequestFromMove = false;
      pIVar59->NavInitResultId = 0;
      pIVar59->NavJustMovedToId = 0;
      if (pIVar59->NavMoveSubmitted == true) {
        NavMoveRequestApplyResult();
      }
      pIVar59->NavTabbingCounter = 0;
      pIVar59->NavMoveSubmitted = false;
      pIVar59->NavMoveScoringItems = false;
      if ((((pIVar59->NavMousePosDirty == true) && (pIVar59->NavIdIsAlive == true)) &&
          (pIVar59->NavDisableHighlight == false)) && (pIVar59->NavDisableMouseHover == true)) {
        uVar70 = (undefined4)
                 CONCAT71((int7)((ulong)pIVar40 >> 8),pIVar59->NavWindow != (ImGuiWindow *)0x0);
      }
      else {
        uVar70 = 0;
      }
      pIVar59->NavMousePosDirty = false;
      IVar55 = pIVar59->NavLayer;
      if (ImGuiNavLayer_Menu < IVar55) {
        __assert_fail("g.NavLayer == ImGuiNavLayer_Main || g.NavLayer == ImGuiNavLayer_Menu",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                      ,0x2a47,"void ImGui::NavUpdate()");
      }
      pIVar42 = pIVar59->NavWindow;
      pIVar50 = pIVar42;
      if (pIVar42 != (ImGuiWindow *)0x0) {
        do {
          if ((pIVar50->RootWindow == pIVar50) || ((pIVar50->Flags & 0x14000000) != 0)) {
            if (pIVar50 != pIVar42) {
              pIVar50->NavLastChildNavWindow = pIVar42;
            }
            break;
          }
          ppIVar17 = &pIVar50->ParentWindow;
          pIVar50 = *ppIVar17;
        } while (*ppIVar17 != (ImGuiWindow *)0x0);
        if (((pIVar42 != (ImGuiWindow *)0x0) && (IVar55 == ImGuiNavLayer_Main)) &&
           (pIVar42->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
          pIVar42->NavLastChildNavWindow = (ImGuiWindow *)0x0;
        }
      }
      pIVar31 = GImGui;
      local_88._0_4_ = uVar81;
      local_98._0_4_ = uVar44;
      pIVar42 = GetTopMostPopupModal();
      if (pIVar42 != (ImGuiWindow *)0x0) {
        pIVar31->NavWindowingTarget = (ImGuiWindow *)0x0;
      }
      if ((pIVar31->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
         (pIVar31->NavWindowingTarget == (ImGuiWindow *)0x0)) {
        fVar62 = (pIVar31->IO).DeltaTime * -10.0 + pIVar31->NavWindowingHighlightAlpha;
        fVar62 = (float)(-(uint)(0.0 <= fVar62) & (uint)fVar62);
        pIVar31->NavWindowingHighlightAlpha = fVar62;
        if ((pIVar31->DimBgRatio <= 0.0) && (fVar62 <= 0.0)) {
          pIVar31->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
        }
      }
      if ((pIVar42 == (ImGuiWindow *)0x0) && (pIVar31->NavWindowingTarget == (ImGuiWindow *)0x0)) {
        bVar33 = (bool)(-((pIVar31->IO).NavInputsDownDuration[3] == 0.0) & 1);
      }
      else {
        bVar33 = false;
      }
      local_6c = uVar70;
      if (((pIVar42 == (ImGuiWindow *)0x0) && (pIVar31->NavWindowingTarget == (ImGuiWindow *)0x0))
         && ((pIVar31->IO).KeyCtrl == true)) {
        bVar34 = IsKeyPressed(0x200,true);
      }
      else {
        bVar34 = false;
      }
      if ((bVar33 | bVar34) == 1) {
        pIVar42 = pIVar31->NavWindow;
        if (pIVar42 == (ImGuiWindow *)0x0) {
          pIVar42 = FindWindowNavFocusable((pIVar31->WindowsFocusOrder).Size + -1,-0x7fffffff,-1);
        }
        if (pIVar42 != (ImGuiWindow *)0x0) {
          pIVar42 = pIVar42->RootWindow;
          pIVar31->NavWindowingTargetAnim = pIVar42;
          pIVar31->NavWindowingTarget = pIVar42;
          pIVar31->NavWindowingTimer = 0.0;
          pIVar31->NavWindowingHighlightAlpha = 0.0;
          pIVar31->NavWindowingToggleLayer = bVar33;
          pIVar31->NavInputSource = bVar34 ^ ImGuiInputSource_Gamepad;
        }
      }
      fVar62 = (pIVar31->IO).DeltaTime + pIVar31->NavWindowingTimer;
      pIVar31->NavWindowingTimer = fVar62;
      if ((pIVar31->NavWindowingTarget == (ImGuiWindow *)0x0) ||
         (pIVar31->NavInputSource != ImGuiInputSource_Gamepad)) {
LAB_00154277:
        bVar33 = false;
        pIVar42 = (ImGuiWindow *)0x0;
      }
      else {
        fVar80 = (fVar62 + -0.2) / 0.05;
        fVar62 = 1.0;
        if (fVar80 <= 1.0) {
          fVar62 = fVar80;
        }
        fVar62 = (float)(~-(uint)(fVar80 < 0.0) & (uint)fVar62);
        uVar44 = -(uint)(fVar62 <= pIVar31->NavWindowingHighlightAlpha);
        pIVar31->NavWindowingHighlightAlpha =
             (float)(uVar44 & (uint)pIVar31->NavWindowingHighlightAlpha | ~uVar44 & (uint)fVar62);
        fVar62 = GetNavInputAmount(0xc,ImGuiInputReadMode_RepeatSlow);
        fVar80 = GetNavInputAmount(0xd,ImGuiInputReadMode_RepeatSlow);
        iVar51 = (uint)(0.0 < fVar62) - (uint)(0.0 < fVar80);
        if (iVar51 != 0) {
          NavUpdateWindowingHighlightWindow(iVar51);
          pIVar31->NavWindowingHighlightAlpha = 1.0;
        }
        if (0.0 < (GImGui->IO).NavInputs[3]) goto LAB_00154277;
        pbVar3 = &pIVar31->NavWindowingToggleLayer;
        *pbVar3 = (bool)(*pbVar3 &
                        (pIVar31->NavWindowingHighlightAlpha <= 1.0 &&
                        pIVar31->NavWindowingHighlightAlpha != 1.0));
        if (*pbVar3 == false) {
          pIVar42 = pIVar31->NavWindowingTarget;
          bVar33 = false;
        }
        else {
          bVar33 = pIVar31->NavWindow != (ImGuiWindow *)0x0;
          pIVar42 = (ImGuiWindow *)0x0;
        }
        pIVar31->NavWindowingTarget = (ImGuiWindow *)0x0;
      }
      if ((pIVar31->NavWindowingTarget != (ImGuiWindow *)0x0) &&
         (pIVar31->NavInputSource == ImGuiInputSource_Keyboard)) {
        fVar80 = (pIVar31->NavWindowingTimer + -0.2) / 0.05;
        fVar62 = 1.0;
        if (fVar80 <= 1.0) {
          fVar62 = fVar80;
        }
        fVar62 = (float)(~-(uint)(fVar80 < 0.0) & (uint)fVar62);
        uVar44 = -(uint)(fVar62 <= pIVar31->NavWindowingHighlightAlpha);
        pIVar31->NavWindowingHighlightAlpha =
             (float)(uVar44 & (uint)pIVar31->NavWindowingHighlightAlpha | ~uVar44 & (uint)fVar62);
        bVar34 = IsKeyPressed(0x200,true);
        if (bVar34) {
          NavUpdateWindowingHighlightWindow((pIVar31->IO).KeyShift - 1 | 1);
        }
        if ((pIVar31->IO).KeyCtrl == false) {
          pIVar42 = pIVar31->NavWindowingTarget;
        }
      }
      if ((((pIVar31->IO).ConfigFlags & 1) != 0) && (bVar34 = IsKeyPressed(0x283,true), bVar34)) {
        pIVar31->NavWindowingToggleLayer = true;
        pIVar31->NavInputSource = ImGuiInputSource_Keyboard;
      }
      if ((pIVar31->NavWindowingToggleLayer == true) &&
         (pIVar31->NavInputSource == ImGuiInputSource_Keyboard)) {
        if ((0 < (pIVar31->IO).InputQueueCharacters.Size) ||
           ((((pIVar31->IO).KeyCtrl != false || ((pIVar31->IO).KeyShift != false)) ||
            ((pIVar31->IO).KeySuper == true)))) {
          pIVar31->NavWindowingToggleLayer = false;
        }
        bVar34 = bVar33;
        if (((0.0 <= (GImGui->IO).KeysData[0x283].DownDurationPrev) &&
            ((GImGui->IO).KeysData[0x283].Down == false)) &&
           ((pIVar31->NavWindowingToggleLayer == true &&
            ((pIVar31->ActiveId == 0 || (pIVar31->ActiveIdAllowOverlap == true)))))) {
          bVar35 = IsMousePosValid(&(pIVar31->IO).MousePos);
          bVar36 = IsMousePosValid(&(pIVar31->IO).MousePosPrev);
          bVar34 = true;
          if (bVar36 != bVar35) {
            bVar34 = bVar33;
          }
        }
        bVar33 = bVar34;
        if ((GImGui->IO).KeysData[0x283].Down == false) {
          pIVar31->NavWindowingToggleLayer = false;
        }
      }
      pIVar50 = pIVar31->NavWindowingTarget;
      if ((pIVar50 != (ImGuiWindow *)0x0) && ((pIVar50->Flags & 4) == 0)) {
        IVar64.x = 0.0;
        IVar64.y = 0.0;
        if ((pIVar31->NavInputSource == ImGuiInputSource_Keyboard) &&
           ((pIVar31->IO).KeyShift == false)) {
          IVar64.x = (float)(int)(GImGui->IO).KeysData[0x202].Down -
                     (float)(int)(GImGui->IO).KeysData[0x201].Down;
          IVar64.y = (float)(int)(GImGui->IO).KeysData[0x204].Down -
                     (float)(int)(GImGui->IO).KeysData[0x203].Down;
        }
        if (pIVar31->NavInputSource == ImGuiInputSource_Gamepad) {
          IVar64 = GetNavInputAmount2d(8,ImGuiInputReadMode_Down,0.0,0.0);
        }
        fVar62 = IVar64.y;
        if (((IVar64.x != 0.0) || (fVar62 != 0.0)) || (NAN(fVar62))) {
          fVar80 = (pIVar31->IO).DisplayFramebufferScale.x;
          fVar78 = (pIVar31->IO).DisplayFramebufferScale.y;
          if (fVar78 <= fVar80) {
            fVar80 = fVar78;
          }
          fVar80 = (float)(int)(fVar80 * (pIVar31->IO).DeltaTime * 800.0);
          pIVar50 = pIVar50->RootWindowDockTree;
          local_a8.Min.x = IVar64.x * fVar80 + (pIVar50->Pos).x;
          local_a8.Min.y = fVar62 * fVar80 + (pIVar50->Pos).y;
          SetWindowPos(pIVar50,&local_a8.Min,1);
          if (((pIVar50->Flags & 0x100) == 0) && (GImGui->SettingsDirtyTimer <= 0.0)) {
            GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
          }
          pIVar31->NavDisableMouseHover = true;
        }
      }
      if (pIVar42 != (ImGuiWindow *)0x0) {
        pIVar50 = pIVar31->NavWindow;
        if (pIVar50 == (ImGuiWindow *)0x0) {
          pIVar39 = (ImGuiViewportP *)0x0;
LAB_0015457e:
          ClearActiveID();
          pIVar40 = GImGui;
          pIVar40->NavMousePosDirty = true;
          pIVar40->NavDisableHighlight = false;
          pIVar40->NavDisableMouseHover = true;
          pIVar42 = NavRestoreLastChildNavWindow(pIVar42);
          ClosePopupsOverWindow(pIVar42,false);
          FocusWindow(pIVar42);
          if (pIVar42->NavLastIds[0] == 0) {
            NavInitWindow(pIVar42,false);
          }
          if ((pIVar42->DC).NavLayersActiveMaskNext == 2) {
            pIVar31->NavLayer = ImGuiNavLayer_Menu;
          }
          if ((pIVar42->Viewport != pIVar39) &&
             (p_Var22 = (pIVar31->PlatformIO).Platform_SetWindowFocus,
             p_Var22 != (_func_void_ImGuiViewport_ptr *)0x0)) {
            (*p_Var22)(&pIVar42->Viewport->super_ImGuiViewport);
          }
          if (pIVar42 == (ImGuiWindow *)0x0) goto LAB_00154608;
        }
        else if (pIVar42 != pIVar50->RootWindow) {
          pIVar39 = pIVar50->Viewport;
          goto LAB_0015457e;
        }
        pIVar31->NavWindowingTarget = (ImGuiWindow *)0x0;
      }
LAB_00154608:
      if ((bVar33) && (pIVar31->NavWindow != (ImGuiWindow *)0x0)) {
        ClearActiveID();
        pIVar42 = pIVar31->NavWindow;
        pIVar50 = pIVar42;
        do {
          window = pIVar50;
          if ((window->ParentWindow == (ImGuiWindow *)0x0) ||
             (((window->DC).NavLayersActiveMask & 2) != 0)) break;
          pIVar50 = window->ParentWindow;
        } while ((window->Flags & 0x15000000U) == 0x1000000);
        if (window != pIVar42) {
          FocusWindow(window);
          window->NavLastChildNavWindow = pIVar42;
        }
        IVar55 = ImGuiNavLayer_Main;
        if (((pIVar31->NavWindow->DC).NavLayersActiveMask & 2) != 0) {
          IVar55 = pIVar31->NavLayer ^ ImGuiNavLayer_Menu;
        }
        if (IVar55 != pIVar31->NavLayer) {
          if ((IVar55 == ImGuiNavLayer_Menu) && (window->DockNodeAsHost == (ImGuiDockNode *)0x0)) {
            pIVar31->NavWindow->NavLastIds[1] = 0;
          }
          NavRestoreLayer(IVar55);
          pIVar31 = GImGui;
          pIVar31->NavMousePosDirty = true;
          pIVar31->NavDisableHighlight = false;
          pIVar31->NavDisableMouseHover = true;
        }
      }
      bVar57 = local_98[0] | local_88[0];
      uVar44 = CONCAT31(local_98._1_3_,bVar57);
      if (((bVar57 & 1) == 0) || (pIVar59->NavWindow == (ImGuiWindow *)0x0)) {
        (pIVar59->IO).NavActive = false;
LAB_0015471a:
        bVar33 = pIVar59->NavWindowingTarget != (ImGuiWindow *)0x0;
      }
      else {
        bVar33 = (pIVar59->NavWindow->Flags & 0x40000U) == 0;
        (pIVar59->IO).NavActive = bVar33;
        if (((!bVar33) || (pIVar59->NavId == 0)) ||
           (bVar33 = true, pIVar59->NavDisableHighlight != false)) goto LAB_0015471a;
      }
      (pIVar59->IO).NavVisible = bVar33;
      pIVar31 = GImGui;
      fVar62 = (GImGui->IO).NavInputsDownDuration[1];
      if ((fVar62 == 0.0) && (!NAN(fVar62))) {
        if (GImGui->ActiveId == 0) {
          if (GImGui->NavLayer == ImGuiNavLayer_Main) {
            pIVar42 = GImGui->NavWindow;
            if (((pIVar42 == (ImGuiWindow *)0x0) || (pIVar42 == pIVar42->RootWindow)) ||
               (((pIVar42->Flags & 0x4000000) != 0 ||
                (pIVar50 = pIVar42->ParentWindow, pIVar50 == (ImGuiWindow *)0x0)))) {
              iVar51 = (GImGui->OpenPopupStack).Size;
              if ((long)iVar51 < 1) {
                if ((pIVar42 != (ImGuiWindow *)0x0) && ((pIVar42->Flags & 0x5000000U) != 0x1000000))
                {
                  pIVar42->NavLastIds[0] = 0;
                }
                pIVar31->NavId = 0;
                pIVar31->NavFocusScopeId = 0;
              }
              else if ((((GImGui->OpenPopupStack).Data[(long)iVar51 + -1].Window)->Flags & 0x8000000
                       ) == 0) {
                ClosePopupToLevel(iVar51 + -1,true);
              }
              goto LAB_0015478b;
            }
            if (pIVar42->ChildId == 0) {
              __assert_fail("child_window->ChildId != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                            ,0x2bc6,"void ImGui::NavUpdateCancelRequest()");
            }
            fVar62 = (pIVar42->Pos).x;
            local_68._0_16_ = ZEXT416((uint)fVar62);
            fVar80 = (pIVar42->Pos).y;
            local_48 = ZEXT416((uint)fVar80);
            local_98 = ZEXT416((uint)((pIVar42->Size).x + fVar62));
            local_88 = ZEXT416((uint)((pIVar42->Size).y + fVar80));
            FocusWindow(pIVar50);
            fVar62 = (pIVar50->DC).CursorStartPos.x;
            fVar80 = (pIVar50->DC).CursorStartPos.y;
            local_a8.Min.x = (float)local_68._0_4_ - fVar62;
            local_a8.Min.y = (float)local_48._0_4_ - fVar80;
            local_a8.Max.y = (float)local_88._0_4_ - fVar80;
            local_a8.Max.x = (float)local_98._0_4_ - fVar62;
            SetNavID(pIVar42->ChildId,ImGuiNavLayer_Main,0,&local_a8);
          }
          else {
            NavRestoreLayer(ImGuiNavLayer_Main);
          }
          pIVar31 = GImGui;
          pIVar31->NavMousePosDirty = true;
          pIVar31->NavDisableHighlight = false;
          pIVar31->NavDisableMouseHover = true;
        }
        else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
          ClearActiveID();
        }
      }
LAB_0015478b:
      pIVar59->NavActivateId = 0;
      pIVar59->NavActivateDownId = 0;
      pIVar59->NavActivatePressedId = 0;
      pIVar59->NavActivateInputId = 0;
      pIVar59->NavActivateFlags = 0;
      IVar52 = pIVar59->NavId;
      if ((((IVar52 != 0) && (pIVar59->NavDisableHighlight == false)) &&
          (pIVar59->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
         ((pIVar59->NavWindow != (ImGuiWindow *)0x0 && ((pIVar59->NavWindow->Flags & 0x40000) == 0))
         )) {
        fVar62 = (GImGui->IO).NavInputs[0];
        if (0.0 < fVar62) {
          bVar33 = (GImGui->IO).NavInputsDownDuration[0] == 0.0;
        }
        else {
          bVar33 = false;
        }
        if ((GImGui->IO).NavInputs[2] <= 0.0) {
          bVar34 = false;
        }
        else {
          bVar34 = (GImGui->IO).NavInputsDownDuration[2] == 0.0;
        }
        IVar10 = pIVar59->ActiveId;
        if (bVar33 && IVar10 == 0) {
          pIVar59->NavActivateId = IVar52;
          pIVar59->NavActivateFlags = 2;
        }
        if (IVar10 == 0) {
          if (bVar34) goto LAB_00154eb2;
        }
        else if ((bool)(bVar34 & IVar10 == IVar52)) {
LAB_00154eb2:
          pIVar59->NavActivateInputId = IVar52;
          pIVar59->NavActivateFlags = 1;
        }
        if (IVar10 == 0) {
          if (0.0 < fVar62) goto LAB_00154edf;
        }
        else if (IVar10 == IVar52 && 0.0 < fVar62) {
LAB_00154edf:
          pIVar59->NavActivateDownId = IVar52;
        }
        if (IVar10 == 0) {
          if (bVar33) goto LAB_00154f10;
        }
        else if ((bool)(bVar33 & IVar10 == IVar52)) {
LAB_00154f10:
          pIVar59->NavActivatePressedId = IVar52;
        }
      }
      pIVar42 = pIVar59->NavWindow;
      if ((pIVar42 != (ImGuiWindow *)0x0) && ((pIVar42->Flags & 0x40000) != 0)) {
        pIVar59->NavDisableHighlight = true;
      }
      if ((pIVar59->NavActivateId != 0) && (pIVar59->NavActivateDownId != pIVar59->NavActivateId)) {
        __assert_fail("g.NavActivateDownId == g.NavActivateId",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                      ,0x2a74,"void ImGui::NavUpdate()");
      }
      IVar52 = pIVar59->NavNextActivateId;
      if (IVar52 != 0) {
        uVar81 = pIVar59->NavNextActivateFlags;
        pIVar42 = (ImGuiWindow *)(ulong)uVar81;
        if ((uVar81 & 1) == 0) {
          pIVar59->NavActivatePressedId = IVar52;
          pIVar59->NavActivateDownId = IVar52;
          pIVar59->NavActivateId = IVar52;
        }
        else {
          pIVar59->NavActivateInputId = IVar52;
        }
        pIVar59->NavActivateFlags = uVar81;
      }
      pIVar59->NavNextActivateId = 0;
      pIVar31 = GImGui;
      pIVar50 = GImGui->NavWindow;
      if ((pIVar50 != (ImGuiWindow *)0x0 & GImGui->NavMoveForwardToNextFrame) == 1) {
        if ((GImGui->NavMoveDir == -1) || (GImGui->NavMoveClipDir == -1)) {
          __assert_fail("g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                        ,0x2ad7,"void ImGui::NavUpdateCreateMoveRequest()");
        }
        if ((GImGui->NavMoveFlags & 0x80) == 0) {
          __assert_fail("g.NavMoveFlags & ImGuiNavMoveFlags_Forwarded",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                        ,0x2ad8,"void ImGui::NavUpdateCreateMoveRequest()");
        }
      }
      else {
        GImGui->NavMoveDir = -1;
        pIVar31->NavMoveFlags = 0;
        pIVar31->NavMoveScrollFlags = 0;
        if (((pIVar50 != (ImGuiWindow *)0x0) && (pIVar31->NavWindowingTarget == (ImGuiWindow *)0x0))
           && ((pIVar50->Flags & 0x40000) == 0)) {
          uVar81 = pIVar31->ActiveIdUsingNavDirMask;
          if (((uVar81 & 1) == 0) &&
             ((fVar62 = GetNavInputAmount(4,ImGuiInputReadMode_Repeat), 0.0 < fVar62 ||
              (fVar62 = GetNavInputAmount(0x10,ImGuiInputReadMode_Repeat), 0.0 < fVar62)))) {
            pIVar31->NavMoveDir = 0;
          }
          if (((uVar81 & 2) == 0) &&
             ((fVar62 = GetNavInputAmount(5,ImGuiInputReadMode_Repeat), 0.0 < fVar62 ||
              (fVar62 = GetNavInputAmount(0x11,ImGuiInputReadMode_Repeat), 0.0 < fVar62)))) {
            pIVar31->NavMoveDir = 1;
          }
          if (((uVar81 & 4) == 0) &&
             ((fVar62 = GetNavInputAmount(6,ImGuiInputReadMode_Repeat), 0.0 < fVar62 ||
              (fVar62 = GetNavInputAmount(0x12,ImGuiInputReadMode_Repeat), 0.0 < fVar62)))) {
            pIVar31->NavMoveDir = 2;
          }
          if (((uVar81 & 8) == 0) &&
             ((fVar62 = GetNavInputAmount(7,ImGuiInputReadMode_Repeat), 0.0 < fVar62 ||
              (fVar62 = GetNavInputAmount(0x13,ImGuiInputReadMode_Repeat), 0.0 < fVar62)))) {
            pIVar31->NavMoveDir = 3;
          }
        }
        pIVar31->NavMoveClipDir = pIVar31->NavMoveDir;
        (pIVar31->NavScoringNoClipRect).Min.x = 3.4028235e+38;
        (pIVar31->NavScoringNoClipRect).Min.y = 3.4028235e+38;
        (pIVar31->NavScoringNoClipRect).Max.x = -3.4028235e+38;
        (pIVar31->NavScoringNoClipRect).Max.y = -3.4028235e+38;
      }
      fVar62 = 0.0;
      uVar81 = 0;
      uVar82 = 0;
      uVar83 = 0;
      if ((((pIVar50 != (ImGuiWindow *)0x0) && (pIVar31->NavMoveDir == -1)) &&
          (((pIVar31->IO).ConfigFlags & 1U) != 0)) &&
         (((pIVar50->Flags & 0x40000) == 0 && (pIVar31->NavWindowingTarget == (ImGuiWindow *)0x0))))
      {
        local_98._0_4_ = uVar44;
        bVar33 = false;
        bVar34 = false;
        if ((pIVar31->IO).KeysData[0x205].Down == true) {
          bVar34 = ((pIVar31->ActiveIdUsingKeyInputMask).Storage[0] & 0x20) == 0;
        }
        if ((pIVar31->IO).KeysData[0x206].Down == true) {
          bVar33 = ((pIVar31->ActiveIdUsingKeyInputMask).Storage[0] & 0x40) == 0;
        }
        bVar35 = IsKeyPressed(0x207,true);
        if (bVar35) {
          local_68._0_4_ =
               (int)CONCAT71((int7)((ulong)GImGui >> 8),
                             ((GImGui->ActiveIdUsingKeyInputMask).Storage[0] & 0x80) == 0);
        }
        else {
          auVar30._12_4_ = 0;
          auVar30._0_12_ = local_68._4_12_;
          local_68._0_16_ = auVar30 << 0x20;
        }
        bVar35 = IsKeyPressed(0x208,true);
        if (bVar35) {
          uVar70 = (undefined4)
                   CONCAT71((int7)((ulong)pIVar42 >> 8),
                            ((GImGui->ActiveIdUsingKeyInputMask).Storage[0] & 0x100) == 0);
        }
        else {
          uVar70 = 0;
        }
        uVar44 = local_98._0_4_;
        if (bVar34 == bVar33) {
          fVar62 = 0.0;
          uVar81 = 0;
          uVar82 = 0;
          uVar83 = 0;
          if (local_68[0] == (char)uVar70) goto LAB_0015503d;
        }
        if (pIVar31->NavLayer != ImGuiNavLayer_Main) {
          NavRestoreLayer(ImGuiNavLayer_Main);
        }
        if (((pIVar50->DC).NavLayersActiveMask == 0) && ((pIVar50->DC).NavHasScroll == true)) {
          bVar33 = IsKeyPressed(0x205,true);
          if (bVar33) {
            fVar62 = (pIVar50->Scroll).y - ((pIVar50->InnerRect).Max.y - (pIVar50->InnerRect).Min.y)
            ;
          }
          else {
            bVar33 = IsKeyPressed(0x206,true);
            if (!bVar33) {
              if (local_68[0] == '\0') {
                fVar62 = 0.0;
                uVar81 = 0;
                uVar82 = 0;
                uVar83 = 0;
                if ((char)uVar70 != '\0') {
                  (pIVar50->ScrollTarget).y = (pIVar50->ScrollMax).y;
                  (pIVar50->ScrollTargetCenterRatio).y = 0.0;
                  (pIVar50->ScrollTargetEdgeSnapDist).y = 0.0;
                }
              }
              else {
                (pIVar50->ScrollTarget).y = 0.0;
                (pIVar50->ScrollTargetCenterRatio).y = 0.0;
                (pIVar50->ScrollTargetEdgeSnapDist).y = 0.0;
LAB_00154f95:
                fVar62 = 0.0;
                uVar81 = 0;
                uVar82 = 0;
                uVar83 = 0;
              }
              goto LAB_0015503d;
            }
            fVar62 = ((pIVar50->InnerRect).Max.y - (pIVar50->InnerRect).Min.y) + (pIVar50->Scroll).y
            ;
          }
          (pIVar50->ScrollTarget).y = fVar62;
          (pIVar50->ScrollTargetCenterRatio).y = 0.0;
          (pIVar50->ScrollTargetEdgeSnapDist).y = 0.0;
          fVar62 = 0.0;
          uVar81 = 0;
          uVar82 = 0;
          uVar83 = 0;
        }
        else {
          IVar55 = pIVar31->NavLayer;
          pIVar53 = pIVar50->NavRectRel + IVar55;
          fVar62 = GImGui->FontBaseSize * pIVar50->FontWindowScale * pIVar50->FontDpiScale;
          local_48._0_4_ = uVar70;
          if (pIVar50->ParentWindow != (ImGuiWindow *)0x0) {
            fVar62 = fVar62 * pIVar50->ParentWindow->FontWindowScale;
          }
          fVar62 = (pIVar50->NavRectRel[IVar55].Max.y - pIVar50->NavRectRel[IVar55].Min.y) +
                   (((pIVar50->InnerRect).Max.y - (pIVar50->InnerRect).Min.y) - fVar62);
          local_88 = ZEXT416(~-(uint)(fVar62 <= 0.0) & (uint)fVar62);
          bVar33 = IsKeyPressed(0x205,true);
          if (bVar33) {
            pIVar31->NavMoveDir = 3;
            pIVar31->NavMoveClipDir = 2;
            pIVar31->NavMoveFlags = 0x30;
            fVar62 = -(float)local_88._0_4_;
            uVar81 = local_88._4_4_ ^ 0x80000000;
            uVar82 = local_88._8_4_ ^ 0x80000000;
            uVar83 = local_88._12_4_ ^ 0x80000000;
          }
          else {
            bVar33 = IsKeyPressed(0x206,true);
            if (bVar33) {
              pIVar31->NavMoveDir = 2;
              pIVar31->NavMoveClipDir = 3;
              pIVar31->NavMoveFlags = 0x30;
              fVar62 = (float)local_88._0_4_;
              uVar81 = local_88._4_4_;
              uVar82 = local_88._8_4_;
              uVar83 = local_88._12_4_;
            }
            else {
              if (local_68[0] != '\0') {
                pIVar50->NavRectRel[IVar55].Max.y = 0.0;
                pIVar50->NavRectRel[IVar55].Min.y = 0.0;
                fVar62 = (pIVar53->Min).x;
                pIVar1 = &pIVar50->NavRectRel[IVar55].Max;
                if (pIVar1->x <= fVar62 && fVar62 != pIVar1->x) {
                  pIVar50->NavRectRel[IVar55].Max.x = 0.0;
                  (pIVar53->Min).x = 0.0;
                }
                pIVar31->NavMoveDir = 3;
                pIVar31->NavMoveFlags = 0x50;
                goto LAB_00154f95;
              }
              fVar62 = 0.0;
              uVar81 = 0;
              uVar82 = 0;
              uVar83 = 0;
              if (local_48[0] != '\0') {
                fVar80 = (pIVar50->ContentSize).y;
                pIVar50->NavRectRel[IVar55].Max.y = fVar80;
                pIVar50->NavRectRel[IVar55].Min.y = fVar80;
                fVar80 = (pIVar53->Min).x;
                pIVar1 = &pIVar50->NavRectRel[IVar55].Max;
                if (pIVar1->x <= fVar80 && fVar80 != pIVar1->x) {
                  pIVar50->NavRectRel[IVar55].Max.x = 0.0;
                  (pIVar53->Min).x = 0.0;
                }
                pIVar31->NavMoveDir = 2;
                pIVar31->NavMoveFlags = 0x50;
              }
            }
          }
        }
      }
LAB_0015503d:
      if ((fVar62 != 0.0) || (NAN(fVar62))) {
        IVar64 = (pIVar50->InnerRect).Max;
        (pIVar31->NavScoringNoClipRect).Min = (pIVar50->InnerRect).Min;
        (pIVar31->NavScoringNoClipRect).Max = IVar64;
        (pIVar31->NavScoringNoClipRect).Min.y = (pIVar31->NavScoringNoClipRect).Min.y + fVar62;
        (pIVar31->NavScoringNoClipRect).Max.y = (pIVar31->NavScoringNoClipRect).Max.y + fVar62;
      }
      pIVar31->NavMoveForwardToNextFrame = false;
      if (pIVar31->NavMoveDir != -1) {
        local_88._4_4_ = uVar81;
        local_88._0_4_ = fVar62;
        local_88._8_4_ = uVar82;
        local_88._12_4_ = uVar83;
        NavMoveRequestSubmit
                  (pIVar31->NavMoveDir,pIVar31->NavMoveClipDir,pIVar31->NavMoveFlags,
                   pIVar31->NavMoveScrollFlags);
        fVar62 = (float)local_88._0_4_;
        uVar81 = local_88._4_4_;
        uVar82 = local_88._8_4_;
        uVar83 = local_88._12_4_;
      }
      if (pIVar31->NavMoveSubmitted == true) {
        if (pIVar31->NavId == 0) {
          pIVar31->NavInitRequest = true;
          pIVar31->NavInitRequestFromMove = true;
          pIVar31->NavInitResultId = 0;
          pIVar31->NavDisableHighlight = false;
        }
        if ((pIVar31->NavInputSource == ImGuiInputSource_Gamepad) &&
           (uVar46 = (ulong)pIVar31->NavLayer, uVar46 == 0 && pIVar50 != (ImGuiWindow *)0x0)) {
          uVar11 = pIVar31->NavMoveFlags;
          fVar80 = (pIVar50->DC).CursorStartPos.x;
          fVar78 = (pIVar50->DC).CursorStartPos.y;
          local_a8.Min.x = ((pIVar50->InnerRect).Min.x + -1.0) - fVar80;
          fVar73 = ((pIVar50->InnerRect).Min.y + -1.0) - fVar78;
          local_a8.Min.y = fVar73;
          local_a8.Max.x = ((pIVar50->InnerRect).Max.x + 1.0) - fVar80;
          fVar78 = ((pIVar50->InnerRect).Max.y + 1.0) - fVar78;
          local_a8.Max.y = fVar78;
          if ((uVar11 & 5) == 0 || (uVar11 & 10) == 0) {
            if ((((pIVar50->NavRectRel[uVar46].Min.x < local_a8.Min.x) ||
                 (pIVar50->NavRectRel[uVar46].Min.y < fVar73)) ||
                (local_a8.Max.x < pIVar50->NavRectRel[uVar46].Max.x)) ||
               (fVar78 < pIVar50->NavRectRel[uVar46].Max.y)) {
              fVar74 = GImGui->FontBaseSize * pIVar50->FontWindowScale * pIVar50->FontDpiScale;
              pIVar42 = pIVar50->ParentWindow;
              fVar80 = fVar74;
              if (pIVar42 != (ImGuiWindow *)0x0) {
                fVar80 = pIVar42->FontWindowScale * fVar74;
              }
              if (pIVar42 != (ImGuiWindow *)0x0) {
                fVar74 = fVar74 * pIVar42->FontWindowScale;
              }
              fVar79 = local_a8.Max.x - local_a8.Min.x;
              if (fVar80 * 0.5 <= local_a8.Max.x - local_a8.Min.x) {
                fVar79 = fVar80 * 0.5;
              }
              local_a8.Min.y = -3.4028235e+38;
              bVar33 = (uVar11 & 5) == 0;
              local_88._4_4_ = uVar81;
              local_88._0_4_ = fVar62;
              local_88._8_4_ = uVar82;
              local_88._12_4_ = uVar83;
              if (bVar33) {
                local_a8.Min.x = local_a8.Min.x + fVar79;
              }
              else {
                local_a8.Min.x = -3.4028235e+38;
              }
              local_a8.Max.y = 3.4028235e+38;
              if (bVar33) {
                local_a8.Max.x = local_a8.Max.x - fVar79;
              }
              else {
                local_a8.Max.x = 3.4028235e+38;
              }
              fVar62 = fVar78 - fVar73;
              if (fVar74 * 0.5 <= fVar78 - fVar73) {
                fVar62 = fVar74 * 0.5;
              }
              bVar33 = (uVar11 & 10) == 0;
              if (bVar33) {
                local_a8.Min.y = fVar73 + fVar62;
              }
              if (bVar33) {
                local_a8.Max.y = fVar78 - fVar62;
              }
              ImRect::ClipWithFull(pIVar50->NavRectRel + uVar46,&local_a8);
              pIVar31->NavId = 0;
              pIVar31->NavFocusScopeId = 0;
              fVar62 = (float)local_88._0_4_;
            }
          }
        }
      }
      if (pIVar50 == (ImGuiWindow *)0x0) {
        IVar65.x = 0.0;
        IVar65.y = 0.0;
        IVar77.x = 0.0;
        IVar77.y = 0.0;
      }
      else {
        IVar55 = pIVar31->NavLayer;
        fVar80 = pIVar50->NavRectRel[IVar55].Max.x;
        fVar78 = pIVar50->NavRectRel[IVar55].Min.x;
        fVar73 = pIVar50->NavRectRel[IVar55].Min.y;
        fVar74 = pIVar50->NavRectRel[IVar55].Max.y;
        fVar79 = 0.0;
        fVar75 = 0.0;
        fVar76 = 0.0;
        fVar63 = 0.0;
        if (fVar78 <= fVar80 && fVar73 <= fVar74) {
          fVar79 = fVar73;
          fVar75 = fVar74;
          fVar76 = fVar80;
          fVar63 = fVar78;
        }
        fVar80 = (pIVar50->DC).CursorStartPos.y;
        fVar78 = fVar79 + fVar80 + fVar62;
        fVar62 = fVar75 + fVar80 + fVar62;
        if (fVar62 < fVar78) {
          __assert_fail("!scoring_rect.IsInverted()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                        ,0x2b31,"void ImGui::NavUpdateCreateMoveRequest()");
        }
        fVar80 = (pIVar50->DC).CursorStartPos.x;
        fVar76 = fVar76 + fVar80;
        fVar80 = fVar63 + fVar80 + 1.0;
        if (fVar76 <= fVar80) {
          fVar80 = fVar76;
        }
        IVar77.y = fVar78;
        IVar77.x = fVar80;
        IVar65.y = fVar62;
        IVar65.x = fVar80;
      }
      (pIVar31->NavScoringRect).Min = IVar77;
      (pIVar31->NavScoringRect).Max = IVar65;
      if (IVar77.x < (pIVar31->NavScoringNoClipRect).Min.x) {
        (pIVar31->NavScoringNoClipRect).Min.x = IVar77.x;
      }
      if (IVar77.y < (pIVar31->NavScoringNoClipRect).Min.y) {
        (pIVar31->NavScoringNoClipRect).Min.y = IVar77.y;
      }
      pIVar1 = &(pIVar31->NavScoringNoClipRect).Max;
      fVar62 = IVar65.x;
      if (pIVar1->x <= fVar62 && fVar62 != pIVar1->x) {
        (pIVar31->NavScoringNoClipRect).Max.x = fVar62;
      }
      fVar62 = IVar65.y;
      pfVar7 = &(pIVar31->NavScoringNoClipRect).Max.y;
      if (*pfVar7 <= fVar62 && fVar62 != *pfVar7) {
        (pIVar31->NavScoringNoClipRect).Max.y = fVar62;
      }
      pIVar31 = GImGui;
      if (pIVar59->NavMoveDir == -1) {
        if (GImGui->NavMoveDir != -1) {
          __assert_fail("g.NavMoveDir == ImGuiDir_None",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                        ,0x2b3d,"void ImGui::NavUpdateCreateTabbingRequest()");
        }
        pIVar42 = GImGui->NavWindow;
        if (((((pIVar42 != (ImGuiWindow *)0x0) && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)
              ) && (((pIVar42->Flags & 0x40000) == 0 &&
                    ((bVar33 = IsKeyPressed(0x200,true), bVar33 &&
                     (((GImGui->ActiveIdUsingKeyInputMask).Storage[0] & 1) == 0)))))) &&
            ((pIVar31->IO).KeyCtrl == false)) && ((pIVar31->IO).KeyAlt == false)) {
          uVar81 = 0xffffffff;
          if ((pIVar31->IO).KeyShift == false) {
            uVar81 = (uint)(pIVar31->ActiveId != 0);
          }
          pIVar31->NavTabbingDir = uVar81;
          scroll_flags = 3;
          if (pIVar42->Appearing != false) {
            scroll_flags = 0x21;
          }
          NavMoveRequestSubmit(-1,uVar81 >> 0x1f ^ 3,0x400,scroll_flags);
          (pIVar31->NavTabbingResultFirst).InFlags = 0;
          (pIVar31->NavTabbingResultFirst).DistBox = 3.4028235e+38;
          (pIVar31->NavTabbingResultFirst).Window = (ImGuiWindow *)0x0;
          (pIVar31->NavTabbingResultFirst).ID = 0;
          (pIVar31->NavTabbingResultFirst).FocusScopeId = 0;
          (pIVar31->NavTabbingResultFirst).DistCenter = 3.4028235e+38;
          (pIVar31->NavTabbingResultFirst).DistAxial = 3.4028235e+38;
          pIVar31->NavTabbingCounter = -1;
        }
      }
      pIVar31 = GImGui;
      if (GImGui->NavMoveScoringItems == false) {
        pbVar3 = &GImGui->NavInitRequest;
        GImGui->NavAnyRequest = *pbVar3;
        if (*pbVar3 != false) goto LAB_0015544b;
      }
      else {
        GImGui->NavAnyRequest = true;
LAB_0015544b:
        if (pIVar31->NavWindow == (ImGuiWindow *)0x0) {
          __assert_fail("g.NavWindow != __null",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                        ,0x2986,"void ImGui::NavUpdateAnyRequestFlag()");
        }
      }
      pIVar59->NavIdIsAlive = false;
      pIVar42 = pIVar59->NavWindow;
      if (((pIVar42 != (ImGuiWindow *)0x0) && ((pIVar42->Flags & 0x40000) == 0)) &&
         (pIVar59->NavWindowingTarget == (ImGuiWindow *)0x0)) {
        fVar62 = pIVar31->FontBaseSize * pIVar42->FontWindowScale * pIVar42->FontDpiScale;
        if (pIVar42->ParentWindow != (ImGuiWindow *)0x0) {
          fVar62 = fVar62 * pIVar42->ParentWindow->FontWindowScale;
        }
        fVar62 = (float)(int)(fVar62 * 100.0 * (pIVar59->IO).DeltaTime + 0.5);
        local_98 = ZEXT416((uint)fVar62);
        if (((pIVar42->DC).NavLayersActiveMask == 0) &&
           (uVar81 = pIVar59->NavMoveDir, (uVar81 != 0xffffffff & (pIVar42->DC).NavHasScroll) == 1))
        {
          if (uVar81 < 2) {
            (pIVar42->ScrollTarget).x =
                 (float)(int)(*(float *)(&DAT_001e3138 + (ulong)(uVar81 == 0) * 4) * fVar62 +
                             (pIVar42->Scroll).x);
            (pIVar42->ScrollTargetCenterRatio).x = 0.0;
            (pIVar42->ScrollTargetEdgeSnapDist).x = 0.0;
          }
          if ((uVar81 & 0xfffffffe) == 2) {
            (pIVar42->ScrollTarget).y =
                 (float)(int)(*(float *)(&DAT_001e3138 + (ulong)(uVar81 == 2) * 4) * fVar62 +
                             (pIVar42->Scroll).y);
            (pIVar42->ScrollTargetCenterRatio).y = 0.0;
            (pIVar42->ScrollTargetEdgeSnapDist).y = 0.0;
          }
        }
        IVar64 = GetNavInputAmount2d(8,ImGuiInputReadMode_Down,0.1,10.0);
        fVar62 = IVar64.x;
        fVar80 = IVar64.y;
        if (((fVar62 != 0.0) || (NAN(fVar62))) && (pIVar42->ScrollbarX == true)) {
          (pIVar42->ScrollTarget).x =
               (float)(int)(fVar62 * (float)local_98._0_4_ + (pIVar42->Scroll).x);
          (pIVar42->ScrollTargetCenterRatio).x = 0.0;
          (pIVar42->ScrollTargetEdgeSnapDist).x = 0.0;
        }
        if ((fVar80 != 0.0) || (NAN(fVar80))) {
          (pIVar42->ScrollTarget).y =
               (float)(int)(fVar80 * (float)local_98._0_4_ + (pIVar42->Scroll).y);
          (pIVar42->ScrollTargetCenterRatio).y = 0.0;
          (pIVar42->ScrollTargetEdgeSnapDist).y = 0.0;
        }
      }
      if ((uVar44 & 1) == 0) {
        pIVar59->NavDisableHighlight = true;
        pIVar59->NavDisableMouseHover = false;
      }
      else if ((((char)local_6c != '\0') && (((pIVar59->IO).ConfigFlags & 4) != 0)) &&
              (((pIVar59->IO).BackendFlags & 4) != 0)) {
        IVar64 = NavCalcPreferredRefPos();
        (pIVar59->IO).MousePosPrev = IVar64;
        (pIVar59->IO).MousePos = IVar64;
        (pIVar59->IO).WantSetMousePos = true;
      }
      pIVar59->NavScoringDebugCount = 0;
      pIVar31 = GImGui;
      pIVar1 = &(GImGui->IO).MousePos;
      bVar33 = IsMousePosValid(pIVar1);
      if (!bVar33) goto LAB_0015571b;
      fVar62 = pIVar1->x;
      if (0.0 <= fVar62) {
LAB_001556cb:
        iVar51 = (int)fVar62;
      }
      else {
        if ((fVar62 == (float)(int)fVar62) && (!NAN(fVar62) && !NAN((float)(int)fVar62)))
        goto LAB_001556cb;
        iVar51 = (int)fVar62 + -1;
      }
      fVar62 = (pIVar31->IO).MousePos.y;
      if (0.0 <= fVar62) {
LAB_001556f6:
        iVar37 = (int)fVar62;
      }
      else {
        if ((fVar62 == (float)(int)fVar62) && (!NAN(fVar62) && !NAN((float)(int)fVar62)))
        goto LAB_001556f6;
        iVar37 = (int)fVar62 + -1;
      }
      IVar66.x = (float)iVar51;
      IVar66.y = (float)iVar37;
      pIVar31->MouseLastValidPos = IVar66;
      (pIVar31->IO).MousePos = IVar66;
LAB_0015571b:
      bVar33 = IsMousePosValid(pIVar1);
      if ((bVar33) && (bVar33 = IsMousePosValid(&(pIVar31->IO).MousePosPrev), bVar33)) {
        IVar67.x = (pIVar31->IO).MousePos.x - (pIVar31->IO).MousePosPrev.x;
        IVar67.y = (pIVar31->IO).MousePos.y - (pIVar31->IO).MousePosPrev.y;
        (pIVar31->IO).MouseDelta = IVar67;
      }
      else {
        (pIVar31->IO).MouseDelta.x = 0.0;
        (pIVar31->IO).MouseDelta.y = 0.0;
      }
      if ((((pIVar31->IO).MouseDelta.x != 0.0) ||
          (fVar62 = (pIVar31->IO).MouseDelta.y, fVar62 != 0.0)) || (NAN(fVar62))) {
        pIVar31->NavDisableMouseHover = false;
      }
      (pIVar31->IO).MousePosPrev = (pIVar31->IO).MousePos;
      lVar58 = 0;
      do {
        bVar33 = (pIVar31->IO).MouseDown[lVar58];
        if (bVar33 == true) {
          pfVar7 = (pIVar31->IO).MouseDownDuration + lVar58;
          bVar34 = *pfVar7 <= 0.0 && *pfVar7 != 0.0;
        }
        else {
          bVar34 = false;
        }
        (pIVar31->IO).MouseClicked[lVar58] = bVar34;
        (pIVar31->IO).MouseClickedCount[lVar58] = 0;
        if (bVar33 == false) {
          bVar35 = 0.0 <= (pIVar31->IO).MouseDownDuration[lVar58];
        }
        else {
          bVar35 = false;
        }
        (pIVar31->IO).MouseReleased[lVar58] = bVar35;
        fVar62 = (pIVar31->IO).MouseDownDuration[lVar58];
        (pIVar31->IO).MouseDownDurationPrev[lVar58] = fVar62;
        fVar80 = -1.0;
        if ((bVar33 != false) && (fVar80 = 0.0, 0.0 <= fVar62)) {
          fVar80 = fVar62 + (pIVar31->IO).DeltaTime;
        }
        (pIVar31->IO).MouseDownDuration[lVar58] = fVar80;
        if (bVar34 == false) {
          if (bVar33 != false) {
            bVar33 = IsMousePosValid(pIVar1);
            fVar62 = 0.0;
            fVar80 = 0.0;
            if (bVar33) {
              fVar62 = (pIVar31->IO).MousePos.x - (pIVar31->IO).MouseClickedPos[lVar58].x;
              fVar80 = (pIVar31->IO).MousePos.y - (pIVar31->IO).MouseClickedPos[lVar58].y;
            }
            fVar78 = (pIVar31->IO).MouseDragMaxDistanceSqr[lVar58];
            fVar73 = -fVar80;
            if (-fVar80 <= fVar80) {
              fVar73 = fVar80;
            }
            fVar80 = fVar62 * fVar62 + fVar80 * fVar80;
            uVar44 = -(uint)(fVar80 <= fVar78);
            (pIVar31->IO).MouseDragMaxDistanceSqr[lVar58] =
                 (float)(~uVar44 & (uint)fVar80 | (uint)fVar78 & uVar44);
            fVar80 = -fVar62;
            if (-fVar62 <= fVar62) {
              fVar80 = fVar62;
            }
            fVar62 = (pIVar31->IO).MouseDragMaxDistanceAbs[lVar58].x;
            fVar78 = (pIVar31->IO).MouseDragMaxDistanceAbs[lVar58].y;
            uVar44 = -(uint)(fVar80 <= fVar62);
            (pIVar31->IO).MouseDragMaxDistanceAbs[lVar58].x =
                 (float)(~uVar44 & (uint)fVar80 | (uint)fVar62 & uVar44);
            uVar44 = -(uint)(fVar73 <= fVar78);
            (pIVar31->IO).MouseDragMaxDistanceAbs[lVar58].y =
                 (float)(~uVar44 & (uint)fVar73 | (uint)fVar78 & uVar44);
          }
        }
        else {
          if ((pIVar31->IO).MouseDoubleClickTime <=
              (float)(pIVar31->Time - (pIVar31->IO).MouseClickedTime[lVar58])) {
LAB_001559d0:
            (pIVar31->IO).MouseClickedLastCount[lVar58] = 1;
          }
          else {
            bVar33 = IsMousePosValid(pIVar1);
            fVar62 = 0.0;
            fVar80 = 0.0;
            if (bVar33) {
              fVar62 = (pIVar31->IO).MousePos.x - (pIVar31->IO).MouseClickedPos[lVar58].x;
              fVar80 = (pIVar31->IO).MousePos.y - (pIVar31->IO).MouseClickedPos[lVar58].y;
            }
            fVar78 = (pIVar31->IO).MouseDoubleClickMaxDist;
            if (fVar78 * fVar78 <= fVar62 * fVar62 + fVar80 * fVar80) goto LAB_001559d0;
            pIVar8 = (pIVar31->IO).MouseClickedLastCount + lVar58;
            *pIVar8 = *pIVar8 + 1;
          }
          (pIVar31->IO).MouseClickedTime[lVar58] = pIVar31->Time;
          (pIVar31->IO).MouseClickedPos[lVar58] = (pIVar31->IO).MousePos;
          (pIVar31->IO).MouseClickedCount[lVar58] = (pIVar31->IO).MouseClickedLastCount[lVar58];
          pIVar9 = (pIVar31->IO).MouseDragMaxDistanceAbs + lVar58;
          pIVar9->x = 0.0;
          pIVar9->y = 0.0;
          (pIVar31->IO).MouseDragMaxDistanceSqr[lVar58] = 0.0;
        }
        (pIVar31->IO).MouseDoubleClicked[lVar58] = (pIVar31->IO).MouseClickedCount[lVar58] == 2;
        if ((pIVar31->IO).MouseClicked[lVar58] == true) {
          pIVar31->NavDisableMouseHover = false;
        }
        lVar58 = lVar58 + 1;
      } while (lVar58 != 5);
      DockContextNewFrameUpdateUndocking(ctx);
      UpdateHoveredWindowAndCaptureFlags();
      UpdateMouseMovingWindowNewFrame();
      pIVar42 = GetTopMostPopupModal();
      if ((pIVar42 != (ImGuiWindow *)0x0) ||
         ((ctx->NavWindowingTarget != (ImGuiWindow *)0x0 && (0.0 < ctx->NavWindowingHighlightAlpha))
         )) {
        fVar62 = (ctx->IO).DeltaTime * 6.0 + ctx->DimBgRatio;
        if (1.0 <= fVar62) {
          fVar62 = 1.0;
        }
        ctx->DimBgRatio = fVar62;
      }
      else {
        fVar62 = (ctx->IO).DeltaTime * -10.0 + ctx->DimBgRatio;
        ctx->DimBgRatio = (float)(-(uint)(0.0 <= fVar62) & (uint)fVar62);
      }
      ctx->MouseCursor = 0;
      ctx->WantTextInputNextFrame = -1;
      ctx->WantCaptureMouseNextFrame = -1;
      ctx->WantCaptureKeyboardNextFrame = -1;
      uVar32 = *(undefined3 *)&(ctx->PlatformImeData).field_0x1;
      fVar62 = (ctx->PlatformImeData).InputPos.x;
      uVar29 = *(undefined8 *)&(ctx->PlatformImeData).InputPos.y;
      (ctx->PlatformImeDataPrev).WantVisible = (ctx->PlatformImeData).WantVisible;
      *(undefined3 *)&(ctx->PlatformImeDataPrev).field_0x1 = uVar32;
      (ctx->PlatformImeDataPrev).InputPos.x = fVar62;
      *(undefined8 *)&(ctx->PlatformImeDataPrev).InputPos.y = uVar29;
      (ctx->PlatformImeData).WantVisible = false;
      pIVar31 = GImGui;
      if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
        GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
        bVar33 = IsMousePosValid((ImVec2 *)0x0);
        if ((bVar33) &&
           (fVar80 = (pIVar31->IO).MousePos.x - (pIVar31->WheelingWindowRefMousePos).x,
           fVar78 = (pIVar31->IO).MousePos.y - (pIVar31->WheelingWindowRefMousePos).y,
           fVar62 = (pIVar31->IO).MouseDragThreshold,
           fVar62 * fVar62 < fVar80 * fVar80 + fVar78 * fVar78)) {
          pIVar31->WheelingWindowTimer = 0.0;
        }
        if (pIVar31->WheelingWindowTimer <= 0.0) {
          pIVar31->WheelingWindow = (ImGuiWindow *)0x0;
          pIVar31->WheelingWindowTimer = 0.0;
        }
      }
      pIVar40 = GImGui;
      fVar62 = (pIVar31->IO).MouseWheel;
      if (((((fVar62 != 0.0) || (fVar80 = (pIVar31->IO).MouseWheelH, fVar80 != 0.0)) ||
           (NAN(fVar80))) &&
          ((pIVar31->ActiveId == 0 || (pIVar31->ActiveIdUsingMouseWheel == false)))) &&
         ((pIVar31->HoveredIdPreviousFrame == 0 ||
          (pIVar31->HoveredIdPreviousFrameUsingMouseWheel == false)))) {
        pIVar42 = pIVar31->WheelingWindow;
        if (pIVar42 == (ImGuiWindow *)0x0) {
          pIVar42 = pIVar31->HoveredWindow;
        }
        if ((pIVar42 != (ImGuiWindow *)0x0) && (pIVar42->Collapsed == false)) {
          if (((fVar62 == 0.0) && (!NAN(fVar62))) ||
             (((pIVar31->IO).KeyCtrl != true || ((pIVar31->IO).FontAllowUserScaling != true)))) {
            if ((pIVar31->IO).KeyCtrl == false) {
              if ((pIVar31->IO).KeyShift == true) {
                bVar57 = (pIVar31->IO).ConfigMacOSXBehaviors ^ 1;
              }
              else {
                bVar57 = 0;
              }
              fVar80 = 0.0;
              if (bVar57 == 0) {
                fVar80 = fVar62;
              }
              fVar62 = (pIVar31->IO).NavInputs[(ulong)(bVar57 ^ 1) - 4];
              if ((fVar80 != 0.0) || (NAN(fVar80))) {
                if (GImGui->WheelingWindow != pIVar42) {
                  GImGui->WheelingWindow = pIVar42;
                  pIVar40->WheelingWindowRefMousePos = (pIVar40->IO).MousePos;
                  pIVar40->WheelingWindowTimer = 2.0;
                }
                while ((uVar44 = pIVar42->Flags, (uVar44 >> 0x18 & 1) != 0 &&
                       (((uVar44 & 0x210) == 0x10 ||
                        ((fVar78 = (pIVar42->ScrollMax).y, fVar78 == 0.0 && (!NAN(fVar78)))))))) {
                  pIVar42 = pIVar42->ParentWindow;
                }
                if ((uVar44 & 0x210) == 0) {
                  fVar78 = ((pIVar42->InnerRect).Max.y - (pIVar42->InnerRect).Min.y) * 0.67;
                  fVar73 = pIVar40->FontBaseSize * pIVar42->FontWindowScale * pIVar42->FontDpiScale;
                  if (pIVar42->ParentWindow != (ImGuiWindow *)0x0) {
                    fVar73 = fVar73 * pIVar42->ParentWindow->FontWindowScale;
                  }
                  fVar74 = fVar73 * 5.0;
                  if (fVar78 <= fVar73 * 5.0) {
                    fVar74 = fVar78;
                  }
                  (pIVar42->ScrollTarget).y = (pIVar42->Scroll).y - fVar80 * (float)(int)fVar74;
                  (pIVar42->ScrollTargetCenterRatio).y = 0.0;
                  (pIVar42->ScrollTargetEdgeSnapDist).y = 0.0;
                }
              }
              pIVar31 = GImGui;
              if ((fVar62 != 0.0) || (NAN(fVar62))) {
                if (GImGui->WheelingWindow != pIVar42) {
                  GImGui->WheelingWindow = pIVar42;
                  pIVar31->WheelingWindowRefMousePos = (pIVar31->IO).MousePos;
                  pIVar31->WheelingWindowTimer = 2.0;
                }
                while ((uVar44 = pIVar42->Flags, (uVar44 >> 0x18 & 1) != 0 &&
                       (((uVar44 & 0x210) == 0x10 ||
                        ((fVar80 = (pIVar42->ScrollMax).x, fVar80 == 0.0 && (!NAN(fVar80)))))))) {
                  pIVar42 = pIVar42->ParentWindow;
                }
                if ((uVar44 & 0x210) == 0) {
                  fVar80 = ((pIVar42->InnerRect).Max.x - (pIVar42->InnerRect).Min.x) * 0.67;
                  fVar78 = pIVar31->FontBaseSize * pIVar42->FontWindowScale * pIVar42->FontDpiScale;
                  if (pIVar42->ParentWindow != (ImGuiWindow *)0x0) {
                    fVar78 = fVar78 * pIVar42->ParentWindow->FontWindowScale;
                  }
                  fVar73 = fVar78 + fVar78;
                  if (fVar80 <= fVar78 + fVar78) {
                    fVar73 = fVar80;
                  }
                  (pIVar42->ScrollTarget).x = (pIVar42->Scroll).x - fVar62 * (float)(int)fVar73;
                  (pIVar42->ScrollTargetCenterRatio).x = 0.0;
                  (pIVar42->ScrollTargetEdgeSnapDist).x = 0.0;
                }
              }
            }
          }
          else {
            if (GImGui->WheelingWindow != pIVar42) {
              GImGui->WheelingWindow = pIVar42;
              pIVar40->WheelingWindowRefMousePos = (pIVar40->IO).MousePos;
              pIVar40->WheelingWindowTimer = 2.0;
            }
            fVar62 = pIVar42->FontWindowScale;
            fVar78 = (pIVar31->IO).MouseWheel * 0.1 + fVar62;
            fVar80 = 2.5;
            if (fVar78 <= 2.5) {
              fVar80 = fVar78;
            }
            fVar80 = (float)(-(uint)(fVar78 < 0.5) & 0x3f000000 |
                            ~-(uint)(fVar78 < 0.5) & (uint)fVar80);
            pIVar42->FontWindowScale = fVar80;
            if (pIVar42 == pIVar42->RootWindow) {
              fVar80 = fVar80 / fVar62;
              local_98 = ZEXT416((uint)fVar80);
              fVar80 = 1.0 - fVar80;
              fVar62 = (pIVar42->Size).x;
              fVar78 = (pIVar42->Size).y;
              fVar73 = (pIVar42->Pos).x;
              fVar74 = (pIVar42->Pos).y;
              local_a8.Min.y =
                   (((pIVar31->IO).MousePos.y - fVar74) * fVar80 * fVar78) / fVar78 + fVar74;
              local_a8.Min.x =
                   (((pIVar31->IO).MousePos.x - fVar73) * fVar80 * fVar62) / fVar62 + fVar73;
              SetWindowPos(pIVar42,&local_a8.Min,0);
              IVar68.x = (float)(int)((pIVar42->Size).x * (float)local_98._0_4_);
              IVar68.y = (float)(int)((pIVar42->Size).y * (float)local_98._0_4_);
              pIVar42->Size = IVar68;
              IVar69.x = (float)(int)((pIVar42->SizeFull).x * (float)local_98._0_4_);
              IVar69.y = (float)(int)((float)local_98._0_4_ * (pIVar42->SizeFull).y);
              pIVar42->SizeFull = IVar69;
            }
          }
        }
      }
      if ((ctx->Windows).Size < (ctx->WindowsFocusOrder).Size) {
        __assert_fail("g.WindowsFocusOrder.Size <= g.Windows.Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                      ,0x11e4,"void ImGui::NewFrame()");
      }
      local_98._0_4_ = 0x7f7fffff;
      if ((ctx->GcCompactAll == false) &&
         (fVar62 = (ctx->IO).ConfigMemoryCompactTimer, 0.0 <= fVar62)) {
        local_98._0_4_ = (float)ctx->Time - fVar62;
      }
      uVar44 = (ctx->Windows).Size;
      uVar46 = (ulong)uVar44;
      if (uVar44 != 0) {
        uVar49 = 0;
        do {
          if ((long)(int)uVar46 <= (long)uVar49) {
            pcVar47 = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
            goto LAB_00156b70;
          }
          pIVar42 = (ctx->Windows).Data[uVar49];
          bVar33 = pIVar42->Active;
          pIVar42->WasActive = bVar33;
          pIVar42->BeginCount = 0;
          pIVar42->Active = false;
          pIVar42->WriteAccessed = false;
          if (((bVar33 == false) && (pIVar42->MemoryCompacted == false)) &&
             (pIVar42->LastTimeActive <= (float)local_98._0_4_ &&
              (float)local_98._0_4_ != pIVar42->LastTimeActive)) {
            GcCompactTransientWindowBuffers(pIVar42);
          }
          uVar49 = uVar49 + 1;
          uVar46 = (ulong)(uint)(ctx->Windows).Size;
        } while (uVar49 != uVar46);
      }
      if (0 < (ctx->TablesLastTimeActive).Size) {
        lVar58 = 0;
        lVar61 = 0;
        do {
          fVar62 = (ctx->TablesLastTimeActive).Data[lVar61];
          if ((0.0 <= fVar62) && (fVar62 < (float)local_98._0_4_)) {
            if ((ctx->Tables).Buf.Size <= lVar61) {
              pcVar47 = "T &ImVector<ImGuiTable>::operator[](int) [T = ImGuiTable]";
              goto LAB_00156b70;
            }
            TableGcCompactTransientBuffers
                      ((ImGuiTable *)((long)&((ctx->Tables).Buf.Data)->ID + lVar58));
          }
          lVar61 = lVar61 + 1;
          lVar58 = lVar58 + 0x218;
        } while (lVar61 < (ctx->TablesLastTimeActive).Size);
      }
      if (0 < (ctx->TablesTempData).Size) {
        lVar58 = 0;
        lVar61 = 0;
        do {
          pIVar23 = (ctx->TablesTempData).Data;
          fVar62 = *(float *)((long)&pIVar23->LastTimeActive + lVar58);
          if ((0.0 <= fVar62) && (fVar62 < (float)local_98._0_4_)) {
            TableGcCompactTransientBuffers
                      ((ImGuiTableTempData *)((long)&pIVar23->TableIndex + lVar58));
          }
          lVar61 = lVar61 + 1;
          lVar58 = lVar58 + 0x70;
        } while (lVar61 < (ctx->TablesTempData).Size);
      }
      if (ctx->GcCompactAll != false) {
        GcCompactTransientMiscBuffers();
      }
      ctx->GcCompactAll = false;
      if ((ctx->NavWindow != (ImGuiWindow *)0x0) && (ctx->NavWindow->WasActive == false)) {
        FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
      }
      iVar51 = (ctx->CurrentWindowStack).Capacity;
      if (iVar51 < 0) {
        uVar44 = iVar51 / 2 + iVar51;
        uVar46 = 0;
        if (0 < (int)uVar44) {
          uVar46 = (ulong)uVar44;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar26 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar26 = *piVar26 + 1;
        }
        __dest_00 = (ImGuiWindowStackData *)
                    (*GImAllocatorAllocFunc)(uVar46 * 0x58,GImAllocatorUserData);
        pIVar24 = (ctx->CurrentWindowStack).Data;
        if (pIVar24 != (ImGuiWindowStackData *)0x0) {
          memcpy(__dest_00,pIVar24,(long)(ctx->CurrentWindowStack).Size * 0x58);
          pIVar24 = (ctx->CurrentWindowStack).Data;
          if ((pIVar24 != (ImGuiWindowStackData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar26 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar26 = *piVar26 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar24,GImAllocatorUserData);
        }
        (ctx->CurrentWindowStack).Data = __dest_00;
        (ctx->CurrentWindowStack).Capacity = (int)uVar46;
      }
      (ctx->CurrentWindowStack).Size = 0;
      iVar51 = (ctx->BeginPopupStack).Capacity;
      if (iVar51 < 0) {
        uVar44 = iVar51 / 2 + iVar51;
        uVar46 = 0;
        if (0 < (int)uVar44) {
          uVar46 = (ulong)uVar44;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar26 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar26 = *piVar26 + 1;
        }
        __dest_01 = (ImGuiPopupData *)(*GImAllocatorAllocFunc)(uVar46 * 0x30,GImAllocatorUserData);
        pIVar25 = (ctx->BeginPopupStack).Data;
        if (pIVar25 != (ImGuiPopupData *)0x0) {
          memcpy(__dest_01,pIVar25,(long)(ctx->BeginPopupStack).Size * 0x30);
          pIVar25 = (ctx->BeginPopupStack).Data;
          if ((pIVar25 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar26 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar26 = *piVar26 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar25,GImAllocatorUserData);
        }
        (ctx->BeginPopupStack).Data = __dest_01;
        (ctx->BeginPopupStack).Capacity = (int)uVar46;
      }
      (ctx->BeginPopupStack).Size = 0;
      iVar51 = (ctx->ItemFlagsStack).Capacity;
      if (iVar51 < 0) {
        uVar44 = iVar51 / 2 + iVar51;
        uVar46 = 0;
        if (0 < (int)uVar44) {
          uVar46 = (ulong)uVar44;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar26 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar26 = *piVar26 + 1;
        }
        piVar43 = (int *)(*GImAllocatorAllocFunc)(uVar46 * 4,GImAllocatorUserData);
        piVar26 = (ctx->ItemFlagsStack).Data;
        if (piVar26 != (int *)0x0) {
          memcpy(piVar43,piVar26,(long)(ctx->ItemFlagsStack).Size << 2);
          piVar26 = (ctx->ItemFlagsStack).Data;
          if ((piVar26 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar4 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar4 = *piVar4 + -1;
          }
          (*GImAllocatorFreeFunc)(piVar26,GImAllocatorUserData);
        }
        (ctx->ItemFlagsStack).Data = piVar43;
        (ctx->ItemFlagsStack).Capacity = (int)uVar46;
      }
      (ctx->ItemFlagsStack).Size = 0;
      if ((ctx->ItemFlagsStack).Capacity == 0) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar26 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar26 = *piVar26 + 1;
        }
        piVar43 = (int *)(*GImAllocatorAllocFunc)(0x20,GImAllocatorUserData);
        piVar26 = (ctx->ItemFlagsStack).Data;
        if (piVar26 != (int *)0x0) {
          memcpy(piVar43,piVar26,(long)(ctx->ItemFlagsStack).Size << 2);
          piVar26 = (ctx->ItemFlagsStack).Data;
          if ((piVar26 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar4 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar4 = *piVar4 + -1;
          }
          (*GImAllocatorFreeFunc)(piVar26,GImAllocatorUserData);
        }
        (ctx->ItemFlagsStack).Data = piVar43;
        (ctx->ItemFlagsStack).Capacity = 8;
      }
      (ctx->ItemFlagsStack).Data[(ctx->ItemFlagsStack).Size] = 0;
      (ctx->ItemFlagsStack).Size = (ctx->ItemFlagsStack).Size + 1;
      iVar51 = (ctx->GroupStack).Capacity;
      if (iVar51 < 0) {
        uVar44 = iVar51 / 2 + iVar51;
        uVar46 = 0;
        if (0 < (int)uVar44) {
          uVar46 = (ulong)uVar44;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar26 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar26 = *piVar26 + 1;
        }
        __dest_02 = (ImGuiGroupData *)(*GImAllocatorAllocFunc)(uVar46 * 0x30,GImAllocatorUserData);
        pIVar27 = (ctx->GroupStack).Data;
        if (pIVar27 != (ImGuiGroupData *)0x0) {
          memcpy(__dest_02,pIVar27,(long)(ctx->GroupStack).Size * 0x30);
          pIVar27 = (ctx->GroupStack).Data;
          if ((pIVar27 != (ImGuiGroupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar26 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar26 = *piVar26 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar27,GImAllocatorUserData);
        }
        (ctx->GroupStack).Data = __dest_02;
        (ctx->GroupStack).Capacity = (int)uVar46;
      }
      (ctx->GroupStack).Size = 0;
      DockContextNewFrameUpdateDocking(ctx);
      pIVar31 = GImGui;
      GImGui->DebugItemPickerBreakId = 0;
      if (pIVar31->DebugItemPickerActive == true) {
        uVar44 = pIVar31->HoveredIdPreviousFrame;
        pIVar31->MouseCursor = 7;
        bVar33 = IsKeyPressed(0x20e,true);
        if (bVar33) {
          pIVar31->DebugItemPickerActive = false;
        }
        pIVar40 = GImGui;
        if (uVar44 != 0 && (GImGui->IO).MouseDownDuration[0] == 0.0) {
          pIVar31->DebugItemPickerBreakId = uVar44;
          pIVar31->DebugItemPickerActive = false;
        }
        pIVar5 = &pIVar40->NextWindowData;
        *(byte *)&pIVar5->Flags = (byte)pIVar5->Flags | 0x40;
        (pIVar40->NextWindowData).BgAlphaVal = 0.6;
        BeginTooltipEx(0,0);
        Text("HoveredId: 0x%08X",(ulong)uVar44);
        Text("Press ESC to abort picking.");
        TextColored((GImGui->Style).Colors + (uVar44 == 0),"Click to break in debugger!");
        EndTooltip();
      }
      pIVar31 = GImGui;
      GImGui->DebugHookIdInfo = 0;
      if (pIVar31->FrameCount == (pIVar31->DebugStackTool).LastActiveFrame + 1) {
        IVar52 = pIVar31->HoveredIdPreviousFrame;
        if (IVar52 == 0) {
          IVar52 = pIVar31->ActiveId;
        }
        if ((pIVar31->DebugStackTool).QueryId != IVar52) {
          (pIVar31->DebugStackTool).QueryId = IVar52;
          (pIVar31->DebugStackTool).StackLevel = -1;
          iVar51 = (pIVar31->DebugStackTool).Results.Capacity;
          if (iVar51 < 0) {
            uVar44 = iVar51 / 2 + iVar51;
            uVar46 = 0;
            if (0 < (int)uVar44) {
              uVar46 = (ulong)uVar44;
            }
            if (pIVar31 != (ImGuiContext *)0x0) {
              piVar26 = &(pIVar31->IO).MetricsActiveAllocations;
              *piVar26 = *piVar26 + 1;
            }
            __dest_03 = (ImGuiStackLevelInfo *)
                        (*GImAllocatorAllocFunc)(uVar46 << 6,GImAllocatorUserData);
            pIVar28 = (pIVar31->DebugStackTool).Results.Data;
            if (pIVar28 != (ImGuiStackLevelInfo *)0x0) {
              memcpy(__dest_03,pIVar28,(long)(pIVar31->DebugStackTool).Results.Size << 6);
              pIVar28 = (pIVar31->DebugStackTool).Results.Data;
              if ((pIVar28 != (ImGuiStackLevelInfo *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
                piVar26 = &(GImGui->IO).MetricsActiveAllocations;
                *piVar26 = *piVar26 + -1;
              }
              (*GImAllocatorFreeFunc)(pIVar28,GImAllocatorUserData);
            }
            (pIVar31->DebugStackTool).Results.Data = __dest_03;
            (pIVar31->DebugStackTool).Results.Capacity = (int)uVar46;
          }
          (pIVar31->DebugStackTool).Results.Size = 0;
        }
        if (IVar52 != 0) {
          iVar51 = (pIVar31->DebugStackTool).StackLevel;
          lVar58 = (long)iVar51;
          if ((-1 < lVar58) && (iVar51 < (pIVar31->DebugStackTool).Results.Size)) {
            pIVar28 = (pIVar31->DebugStackTool).Results.Data;
            if ((pIVar28[lVar58].QuerySuccess != false) ||
               ('\x02' < pIVar28[lVar58].QueryFrameCount)) {
              (pIVar31->DebugStackTool).StackLevel = iVar51 + 1;
            }
          }
          uVar44 = (pIVar31->DebugStackTool).StackLevel;
          uVar46 = (ulong)uVar44;
          if (uVar46 == 0xffffffff) {
            pIVar31->DebugHookIdInfo = IVar52;
          }
          if ((-1 < (int)uVar44) && ((int)uVar44 < (pIVar31->DebugStackTool).Results.Size)) {
            pIVar28 = (pIVar31->DebugStackTool).Results.Data;
            pIVar31->DebugHookIdInfo = pIVar28[uVar46].ID;
            pIVar6 = &pIVar28[uVar46].QueryFrameCount;
            *pIVar6 = *pIVar6 + '\x01';
          }
        }
      }
      ctx->WithinFrameScopeWithImplicitWindow = true;
      pIVar31 = GImGui;
      (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 2;
      (pIVar31->NextWindowData).SizeVal.x = 400.0;
      (pIVar31->NextWindowData).SizeVal.y = 400.0;
      (pIVar31->NextWindowData).SizeCond = 4;
      Begin("Debug##Default",(bool *)0x0,0);
      if (ctx->CurrentWindow->IsFallbackWindow != false) {
        if (0 < (ctx->Hooks).Size) {
          lVar58 = 0;
          lVar61 = 0;
          do {
            pIVar12 = (ctx->Hooks).Data;
            if (*(int *)(pIVar12 + lVar58 + 4) == 1) {
              (**(code **)(pIVar12 + lVar58 + 0x10))(ctx,pIVar12 + lVar58);
            }
            lVar61 = lVar61 + 1;
            lVar58 = lVar58 + 0x20;
          } while (lVar61 < (ctx->Hooks).Size);
        }
        return;
      }
      __assert_fail("g.CurrentWindow->IsFallbackWindow == true",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                    ,0x1217,"void ImGui::NewFrame()");
    }
  }
  else {
    if ((~(pIVar31->IO).BackendFlags & 0x1400U) != 0) {
      (pIVar31->IO).ConfigFlags = uVar44 & 0xfffffbff;
LAB_00152c9c:
      lVar58 = (long)(pIVar31->PlatformIO).Monitors.Size;
      if (0 < lVar58) {
        pIVar14 = (pIVar31->PlatformIO).Monitors.Data;
        lVar61 = 0;
        do {
          fVar62 = *(float *)((long)&(pIVar14->MainSize).x + lVar61);
          if ((fVar62 <= 0.0) ||
             (fVar80 = *(float *)((long)&(pIVar14->MainSize).y + lVar61), fVar80 <= 0.0)) {
            __assert_fail("mon.MainSize.x > 0.0f && mon.MainSize.y > 0.0f && \"Monitor main bounds not setup properly.\""
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                          ,0x21d0,"void ImGui::ErrorCheckNewFrameSanityChecks()");
          }
          fVar78 = *(float *)((long)&(pIVar14->MainPos).x + lVar61);
          fVar73 = *(float *)((long)&(pIVar14->WorkPos).x + lVar61);
          if (fVar73 < fVar78) {
LAB_00156a87:
            __assert_fail("ImRect(mon.MainPos, mon.MainPos + mon.MainSize).Contains(ImRect(mon.WorkPos, mon.WorkPos + mon.WorkSize)) && \"Monitor work bounds not setup properly. If you don\'t have work area information, just copy MainPos/MainSize into them.\""
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                          ,0x21d1,"void ImGui::ErrorCheckNewFrameSanityChecks()");
          }
          fVar74 = *(float *)((long)&(pIVar14->MainPos).y + lVar61);
          fVar79 = *(float *)((long)&(pIVar14->WorkPos).y + lVar61);
          if (((fVar79 < fVar74) ||
              (fVar62 + fVar78 < fVar73 + *(float *)((long)&(pIVar14->WorkSize).x + lVar61))) ||
             (fVar80 + fVar74 < fVar79 + *(float *)((long)&(pIVar14->WorkSize).y + lVar61)))
          goto LAB_00156a87;
          fVar62 = *(float *)((long)&pIVar14->DpiScale + lVar61);
          if ((fVar62 == 0.0) && (!NAN(fVar62))) {
            __assert_fail("mon.DpiScale != 0.0f",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                          ,0x21d2,"void ImGui::ErrorCheckNewFrameSanityChecks()");
          }
          lVar61 = lVar61 + 0x24;
        } while (lVar58 * 0x24 != lVar61);
      }
      goto LAB_00152d4b;
    }
    if ((iVar51 != 0) && (iVar51 != pIVar31->FrameCountPlatformEnded)) {
      __assert_fail("(g.FrameCount == 0 || g.FrameCount == g.FrameCountPlatformEnded) && \"Forgot to call UpdatePlatformWindows() in main loop after EndFrame()? Check examples/ applications for reference.\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                    ,0x21b9,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((pIVar31->PlatformIO).Platform_CreateWindow == (_func_void_ImGuiViewport_ptr *)0x0) {
      __assert_fail("g.PlatformIO.Platform_CreateWindow != __null && \"Platform init didn\'t install handlers?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                    ,0x21ba,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((pIVar31->PlatformIO).Platform_DestroyWindow == (_func_void_ImGuiViewport_ptr *)0x0) {
      __assert_fail("g.PlatformIO.Platform_DestroyWindow != __null && \"Platform init didn\'t install handlers?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                    ,0x21bb,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((pIVar31->PlatformIO).Platform_GetWindowPos == (_func_ImVec2_ImGuiViewport_ptr *)0x0) {
      __assert_fail("g.PlatformIO.Platform_GetWindowPos != __null && \"Platform init didn\'t install handlers?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                    ,0x21bc,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((pIVar31->PlatformIO).Platform_SetWindowPos == (_func_void_ImGuiViewport_ptr_ImVec2 *)0x0) {
      __assert_fail("g.PlatformIO.Platform_SetWindowPos != __null && \"Platform init didn\'t install handlers?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                    ,0x21bd,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((pIVar31->PlatformIO).Platform_GetWindowSize == (_func_ImVec2_ImGuiViewport_ptr *)0x0) {
      __assert_fail("g.PlatformIO.Platform_GetWindowSize != __null && \"Platform init didn\'t install handlers?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                    ,0x21be,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((pIVar31->PlatformIO).Platform_SetWindowSize == (_func_void_ImGuiViewport_ptr_ImVec2 *)0x0)
    {
      __assert_fail("g.PlatformIO.Platform_SetWindowSize != __null && \"Platform init didn\'t install handlers?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                    ,0x21bf,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((pIVar31->PlatformIO).Monitors.Size < 1) {
      __assert_fail("g.PlatformIO.Monitors.Size > 0 && \"Platform init didn\'t setup Monitors list?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                    ,0x21c0,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if (0 < (pIVar31->Viewports).Size) {
      pIVar39 = *(pIVar31->Viewports).Data;
      if (((pIVar39->super_ImGuiViewport).PlatformUserData == (void *)0x0) &&
         ((pIVar39->super_ImGuiViewport).PlatformHandle == (void *)0x0)) {
        __assert_fail("(g.Viewports[0]->PlatformUserData != __null || g.Viewports[0]->PlatformHandle != __null) && \"Platform init didn\'t setup main viewport.\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                      ,0x21c1,"void ImGui::ErrorCheckNewFrameSanityChecks()");
      }
      if ((((uVar44 & 0x40) != 0) && ((pIVar31->IO).ConfigDockingTransparentPayload != false)) &&
         ((pIVar31->PlatformIO).Platform_SetWindowAlpha == (_func_void_ImGuiViewport_ptr_float *)0x0
         )) {
        __assert_fail("g.PlatformIO.Platform_SetWindowAlpha != __null && \"Platform_SetWindowAlpha handler is required to use io.ConfigDockingTransparent!\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                      ,0x21c3,"void ImGui::ErrorCheckNewFrameSanityChecks()");
      }
      goto LAB_00152c9c;
    }
  }
LAB_001569dc:
  pcVar47 = "T &ImVector<ImGuiViewportP *>::operator[](int) [T = ImGuiViewportP *]";
LAB_00156b70:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.h"
                ,0x74f,pcVar47);
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

    // Remove pending delete hooks before frame start.
    // This deferred removal avoid issues of removal while iterating the hook vector
    for (int n = g.Hooks.Size - 1; n >= 0; n--)
        if (g.Hooks[n].Type == ImGuiContextHookType_PendingRemoval_)
            g.Hooks.erase(&g.Hooks[n]);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePre);

    // Check and assert for various common IO and Configuration mistakes
    g.ConfigFlagsLastFrame = g.ConfigFlagsCurrFrame;
    ErrorCheckNewFrameSanityChecks();
    g.ConfigFlagsCurrFrame = g.IO.ConfigFlags;

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.FramerateSecPerFrameCount = ImMin(g.FramerateSecPerFrameCount + 1, IM_ARRAYSIZE(g.FramerateSecPerFrame));
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)g.FramerateSecPerFrameCount)) : FLT_MAX;

    UpdateViewportsNewFrame();

    // Setup current font and draw list shared data
    // FIXME-VIEWPORT: the concept of a single ClipRectFullscreen is not ideal!
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    ImRect virtual_space(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        virtual_space.Add(g.Viewports[n]->GetMainRect());
    g.DrawListSharedData.ClipRectFullscreen = virtual_space.ToVec4();
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleTessellationMaxError(g.Style.CircleTessellationMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawData = NULL;
        viewport->DrawDataP.Clear();
    }

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredIdPreviousFrameUsingMouseWheel = g.HoveredIdUsingMouseWheel;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    g.HoveredIdUsingMouseWheel = false;
    g.HoveredIdDisabled = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask.ClearAllBits();
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Close popups on focus lost (currently wip/opt-in)
    //if (g.IO.AppFocusLost)
    //    ClosePopupsExceptModals();

    // Process input queue (trickle as many events as possible)
    g.InputEventsTrail.resize(0);
    UpdateInputEvents(g.IO.ConfigInputTrickleEventQueue);

    // Update keyboard input state
    UpdateKeyboardInputs();

    //IM_ASSERT(g.IO.KeyCtrl == IsKeyDown(ImGuiKey_LeftCtrl) || IsKeyDown(ImGuiKey_RightCtrl));
    //IM_ASSERT(g.IO.KeyShift == IsKeyDown(ImGuiKey_LeftShift) || IsKeyDown(ImGuiKey_RightShift));
    //IM_ASSERT(g.IO.KeyAlt == IsKeyDown(ImGuiKey_LeftAlt) || IsKeyDown(ImGuiKey_RightAlt));
    //IM_ASSERT(g.IO.KeySuper == IsKeyDown(ImGuiKey_LeftSuper) || IsKeyDown(ImGuiKey_RightSuper));

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Undocking
    // (needs to be before UpdateMouseMovingWindowNewFrame so the window is already offset and following the mouse on the detaching frame)
    DockContextNewFrameUpdateUndocking(&g);

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;

    // Platform IME data: reset for the frame
    g.PlatformImeDataPrev = g.PlatformImeData;
    g.PlatformImeData.WantVisible = false;

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size <= g.Windows.Size);
    const float memory_compact_start_time = (g.GcCompactAll || g.IO.ConfigMemoryCompactTimer < 0.0f) ? FLT_MAX : (float)g.Time - g.IO.ConfigMemoryCompactTimer;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Garbage collect transient buffers of recently unused tables
    for (int i = 0; i < g.TablesLastTimeActive.Size; i++)
        if (g.TablesLastTimeActive[i] >= 0.0f && g.TablesLastTimeActive[i] < memory_compact_start_time)
            TableGcCompactTransientBuffers(g.Tables.GetByIndex(i));
    for (int i = 0; i < g.TablesTempData.Size; i++)
        if (g.TablesTempData[i].LastTimeActive >= 0.0f && g.TablesTempData[i].LastTimeActive < memory_compact_start_time)
            TableGcCompactTransientBuffers(&g.TablesTempData[i]);
    if (g.GcCompactAll)
        GcCompactTransientMiscBuffers();
    g.GcCompactAll = false;

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    g.ItemFlagsStack.resize(0);
    g.ItemFlagsStack.push_back(ImGuiItemFlags_None);
    g.GroupStack.resize(0);

    // Docking
    DockContextNewFrameUpdateDocking(&g);

    // [DEBUG] Update debug features
    UpdateDebugToolItemPicker();
    UpdateDebugToolStackQueries();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePost);
}